

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse2::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  undefined4 uVar16;
  ushort uVar17;
  ushort uVar18;
  int iVar19;
  Geometry *pGVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [14];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [15];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [14];
  undefined1 auVar41 [15];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [14];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [15];
  undefined1 auVar62 [14];
  undefined1 auVar63 [15];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [14];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [13];
  undefined1 auVar81 [13];
  undefined1 auVar82 [13];
  undefined1 auVar83 [13];
  undefined1 auVar84 [13];
  undefined1 auVar85 [13];
  undefined1 auVar86 [13];
  undefined1 auVar87 [13];
  undefined1 auVar88 [13];
  undefined1 auVar89 [13];
  undefined1 auVar90 [13];
  undefined1 auVar91 [13];
  undefined1 auVar92 [13];
  undefined1 auVar93 [13];
  undefined1 auVar94 [13];
  undefined1 auVar95 [13];
  undefined1 auVar96 [13];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined8 uVar108;
  undefined8 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [15];
  unkuint9 Var114;
  undefined1 auVar115 [11];
  undefined1 auVar116 [13];
  undefined1 auVar117 [14];
  undefined1 auVar118 [15];
  undefined1 auVar119 [11];
  undefined1 auVar120 [14];
  undefined1 auVar121 [13];
  undefined1 auVar122 [15];
  undefined1 auVar123 [11];
  undefined1 auVar124 [14];
  undefined1 auVar125 [15];
  undefined1 auVar126 [11];
  undefined1 auVar127 [14];
  undefined1 auVar128 [13];
  undefined1 auVar129 [13];
  undefined1 auVar130 [15];
  undefined1 auVar131 [11];
  undefined1 auVar132 [14];
  undefined1 auVar133 [15];
  undefined1 auVar134 [11];
  undefined1 auVar135 [14];
  undefined1 auVar136 [13];
  undefined1 auVar137 [13];
  undefined1 auVar138 [14];
  undefined1 auVar139 [12];
  unkbyte10 Var140;
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  uint6 uVar153;
  uint6 uVar154;
  uint6 uVar155;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar156;
  undefined4 uVar157;
  uint uVar158;
  int iVar159;
  AABBNodeMB4D *node1;
  long lVar160;
  ulong uVar161;
  ulong uVar162;
  RTCRayN *pRVar163;
  RTCFilterFunctionN p_Var164;
  undefined4 uVar165;
  int iVar166;
  undefined4 uVar167;
  long lVar168;
  RTCIntersectArguments *pRVar169;
  long lVar170;
  long lVar171;
  uint uVar172;
  long lVar173;
  uint uVar174;
  ulong uVar175;
  uint uVar176;
  ulong uVar177;
  long lVar178;
  long lVar179;
  long lVar180;
  uint uVar181;
  uint uVar182;
  uint uVar183;
  uint uVar184;
  uint uVar185;
  uint uVar186;
  uint uVar187;
  uint uVar188;
  uint uVar189;
  uint uVar190;
  uint uVar191;
  uint uVar192;
  byte bVar193;
  char cVar194;
  float fVar195;
  float fVar196;
  byte bVar220;
  byte bVar222;
  char cVar226;
  char cVar228;
  char cVar230;
  char cVar233;
  float extraout_XMM0_Dc;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  char cVar221;
  char cVar223;
  byte bVar224;
  char cVar225;
  char cVar227;
  char cVar229;
  char cVar231;
  char cVar234;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float extraout_XMM0_Dd;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar219;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar243;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar257;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar262;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar266;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar267;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar275;
  float fVar294;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar295;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar304;
  float fVar305;
  float fVar316;
  float fVar317;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar319;
  float fVar324;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar334;
  float fVar335;
  float fVar338;
  float fVar339;
  float fVar342;
  float fVar343;
  undefined1 auVar329 [16];
  float fVar336;
  float fVar337;
  float fVar340;
  float fVar341;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar354 [16];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar385;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1440;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_13e8;
  float fStack_13e0;
  float fStack_13dc;
  vbool<4> valid;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  long local_13b8;
  long local_13b0;
  ulong local_13a8;
  ulong local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [16];
  undefined1 local_1288 [8];
  float fStack_1280;
  float fStack_127c;
  float local_1278 [4];
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  int local_1218;
  int iStack_1214;
  int iStack_1210;
  int iStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  long local_1158;
  Scene *local_1150;
  long local_1148;
  ulong local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  int local_1128;
  int iStack_1124;
  int iStack_1120;
  int iStack_111c;
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined1 local_1098 [8];
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined2 uVar232;
  
  local_1440 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1228 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1238 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1268 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1138 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar368 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar343 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1108 = local_1138 * 0.99999964;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  local_1118._0_4_ = fVar368 * 0.99999964;
  local_1118._4_4_ = local_1118._0_4_;
  fStack_1110 = (float)local_1118._0_4_;
  fStack_110c = (float)local_1118._0_4_;
  local_10f8 = fVar343 * 0.99999964;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  local_1138 = local_1138 * 1.0000004;
  local_10d8._0_4_ = fVar368 * 1.0000004;
  local_10d8._4_4_ = local_10d8._0_4_;
  fStack_10d0 = (float)local_10d8._0_4_;
  fStack_10cc = (float)local_10d8._0_4_;
  local_10e8._0_4_ = fVar343 * 1.0000004;
  local_10e8._4_4_ = local_10e8._0_4_;
  fStack_10e0 = (float)local_10e8._0_4_;
  fStack_10dc = (float)local_10e8._0_4_;
  local_1168 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1170 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1178 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1180 = local_1168 ^ 0x10;
  local_1188 = local_1170 ^ 0x10;
  local_1190 = local_1178 ^ 0x10;
  local_1128 = (tray->tnear).field_0.i[k];
  iStack_1124 = local_1128;
  iStack_1120 = local_1128;
  iStack_111c = local_1128;
  local_1218 = (tray->tfar).field_0.i[k];
  iStack_1214 = local_1218;
  iStack_1210 = local_1218;
  iStack_120c = local_1218;
  lVar160 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_1224 = local_1228;
  fStack_1220 = local_1228;
  fStack_121c = local_1228;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1264 = local_1268;
  fStack_1260 = local_1268;
  fStack_125c = local_1268;
  fStack_1134 = local_1138;
  fStack_1130 = local_1138;
  fStack_112c = local_1138;
  fVar326 = local_1138;
  fVar334 = local_1138;
  fVar335 = local_1138;
  fVar338 = local_1138;
  fVar325 = local_1238;
  fVar257 = local_1238;
  fVar346 = local_1238;
  fVar295 = local_1238;
  fVar379 = local_1228;
  fVar294 = local_1228;
  fVar275 = local_1228;
  fVar365 = local_1228;
  fVar196 = local_1268;
  fVar195 = local_1268;
  fVar343 = local_1268;
  fVar368 = local_1268;
  while (local_1440 != stack) {
    pSVar156 = local_1440 + -1;
    local_1440 = local_1440 + -1;
    if ((float)pSVar156->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar156->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar162 = (local_1440->ptr).ptr;
      do {
        if ((uVar162 & 8) == 0) {
          uVar161 = uVar162 & 0xfffffffffffffff0;
          fVar339 = *(float *)(ray + k * 4 + 0x70);
          pfVar13 = (float *)(uVar161 + 0x80 + local_1168);
          pfVar12 = (float *)(uVar161 + 0x20 + local_1168);
          auVar309._0_4_ = ((*pfVar13 * fVar339 + *pfVar12) - fVar365) * local_1108;
          auVar309._4_4_ = ((pfVar13[1] * fVar339 + pfVar12[1]) - fVar275) * fStack_1104;
          auVar309._8_4_ = ((pfVar13[2] * fVar339 + pfVar12[2]) - fVar294) * fStack_1100;
          auVar309._12_4_ = ((pfVar13[3] * fVar339 + pfVar12[3]) - fVar379) * fStack_10fc;
          pfVar14 = (float *)(uVar161 + 0x80 + local_1170);
          pfVar12 = (float *)(uVar161 + 0x20 + local_1170);
          pfVar15 = (float *)(uVar161 + 0x80 + local_1178);
          pfVar13 = (float *)(uVar161 + 0x20 + local_1178);
          auVar276._0_4_ = ((*pfVar14 * fVar339 + *pfVar12) - fVar295) * (float)local_1118._0_4_;
          auVar276._4_4_ = ((pfVar14[1] * fVar339 + pfVar12[1]) - fVar346) * (float)local_1118._4_4_
          ;
          auVar276._8_4_ = ((pfVar14[2] * fVar339 + pfVar12[2]) - fVar257) * fStack_1110;
          auVar276._12_4_ = ((pfVar14[3] * fVar339 + pfVar12[3]) - fVar325) * fStack_110c;
          auVar277._0_4_ = ((*pfVar15 * fVar339 + *pfVar13) - fVar368) * local_10f8;
          auVar277._4_4_ = ((pfVar15[1] * fVar339 + pfVar13[1]) - fVar343) * fStack_10f4;
          auVar277._8_4_ = ((pfVar15[2] * fVar339 + pfVar13[2]) - fVar195) * fStack_10f0;
          auVar277._12_4_ = ((pfVar15[3] * fVar339 + pfVar13[3]) - fVar196) * fStack_10ec;
          auVar277 = maxps(auVar276,auVar277);
          auVar297._4_4_ = iStack_1124;
          auVar297._0_4_ = local_1128;
          auVar297._8_4_ = iStack_1120;
          auVar297._12_4_ = iStack_111c;
          auVar235 = maxps(auVar297,auVar309);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar235,auVar277);
          pfVar14 = (float *)(uVar161 + 0x80 + local_1180);
          pfVar12 = (float *)(uVar161 + 0x20 + local_1180);
          pfVar15 = (float *)(uVar161 + 0x80 + local_1188);
          pfVar13 = (float *)(uVar161 + 0x20 + local_1188);
          auVar278._0_4_ = ((*pfVar14 * fVar339 + *pfVar12) - fVar365) * fVar338;
          auVar278._4_4_ = ((pfVar14[1] * fVar339 + pfVar12[1]) - fVar275) * fVar335;
          auVar278._8_4_ = ((pfVar14[2] * fVar339 + pfVar12[2]) - fVar294) * fVar334;
          auVar278._12_4_ = ((pfVar14[3] * fVar339 + pfVar12[3]) - fVar379) * fVar326;
          auVar296._0_4_ = ((*pfVar15 * fVar339 + *pfVar13) - fVar295) * (float)local_10d8._0_4_;
          auVar296._4_4_ = ((pfVar15[1] * fVar339 + pfVar13[1]) - fVar346) * (float)local_10d8._4_4_
          ;
          auVar296._8_4_ = ((pfVar15[2] * fVar339 + pfVar13[2]) - fVar257) * fStack_10d0;
          auVar296._12_4_ = ((pfVar15[3] * fVar339 + pfVar13[3]) - fVar325) * fStack_10cc;
          pfVar13 = (float *)(uVar161 + 0x80 + local_1190);
          pfVar12 = (float *)(uVar161 + 0x20 + local_1190);
          auVar307._0_4_ = ((*pfVar13 * fVar339 + *pfVar12) - fVar368) * (float)local_10e8._0_4_;
          auVar307._4_4_ = ((pfVar13[1] * fVar339 + pfVar12[1]) - fVar343) * (float)local_10e8._4_4_
          ;
          auVar307._8_4_ = ((pfVar13[2] * fVar339 + pfVar12[2]) - fVar195) * fStack_10e0;
          auVar307._12_4_ = ((pfVar13[3] * fVar339 + pfVar12[3]) - fVar196) * fStack_10dc;
          auVar297 = minps(auVar296,auVar307);
          auVar235._4_4_ = iStack_1214;
          auVar235._0_4_ = local_1218;
          auVar235._8_4_ = iStack_1210;
          auVar235._12_4_ = iStack_120c;
          auVar235 = minps(auVar235,auVar278);
          auVar235 = minps(auVar235,auVar297);
          if (((uint)uVar162 & 7) == 6) {
            bVar25 = (fVar339 < *(float *)(uVar161 + 0xf0) && *(float *)(uVar161 + 0xe0) <= fVar339)
                     && tNear.field_0._0_4_ <= auVar235._0_4_;
            bVar26 = (fVar339 < *(float *)(uVar161 + 0xf4) && *(float *)(uVar161 + 0xe4) <= fVar339)
                     && tNear.field_0._4_4_ <= auVar235._4_4_;
            bVar27 = (fVar339 < *(float *)(uVar161 + 0xf8) && *(float *)(uVar161 + 0xe8) <= fVar339)
                     && tNear.field_0._8_4_ <= auVar235._8_4_;
            bVar28 = (fVar339 < *(float *)(uVar161 + 0xfc) && *(float *)(uVar161 + 0xec) <= fVar339)
                     && tNear.field_0._12_4_ <= auVar235._12_4_;
          }
          else {
            bVar25 = tNear.field_0._0_4_ <= auVar235._0_4_;
            bVar26 = tNear.field_0._4_4_ <= auVar235._4_4_;
            bVar27 = tNear.field_0._8_4_ <= auVar235._8_4_;
            bVar28 = tNear.field_0._12_4_ <= auVar235._12_4_;
          }
          auVar197._0_4_ = (uint)bVar25 * -0x80000000;
          auVar197._4_4_ = (uint)bVar26 * -0x80000000;
          auVar197._8_4_ = (uint)bVar27 * -0x80000000;
          auVar197._12_4_ = (uint)bVar28 * -0x80000000;
          uVar157 = movmskps((int)uVar161,auVar197);
          local_1160 = CONCAT44((int)(uVar161 >> 0x20),uVar157);
        }
        if ((uVar162 & 8) == 0) {
          if (local_1160 == 0) {
            iVar159 = 4;
          }
          else {
            uVar161 = uVar162 & 0xfffffffffffffff0;
            lVar170 = 0;
            if (local_1160 != 0) {
              for (; (local_1160 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
              }
            }
            iVar159 = 0;
            uVar175 = *(ulong *)(uVar161 + lVar170 * 8);
            uVar177 = local_1160 - 1 & local_1160;
            uVar162 = uVar175;
            if (uVar177 != 0) {
              uVar158 = tNear.field_0.i[lVar170];
              lVar170 = 0;
              if (uVar177 != 0) {
                for (; (uVar177 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
                }
              }
              uVar162 = *(ulong *)(uVar161 + lVar170 * 8);
              uVar172 = tNear.field_0.i[lVar170];
              uVar177 = uVar177 - 1 & uVar177;
              if (uVar177 == 0) {
                if (uVar158 < uVar172) {
                  (local_1440->ptr).ptr = uVar162;
                  local_1440->dist = uVar172;
                  uVar162 = uVar175;
                  local_1440 = local_1440 + 1;
                }
                else {
                  (local_1440->ptr).ptr = uVar175;
                  local_1440->dist = uVar158;
                  local_1440 = local_1440 + 1;
                }
              }
              else {
                auVar198._8_4_ = uVar158;
                auVar198._0_8_ = uVar175;
                auVar198._12_4_ = 0;
                auVar236._8_4_ = uVar172;
                auVar236._0_8_ = uVar162;
                auVar236._12_4_ = 0;
                lVar170 = 0;
                if (uVar177 != 0) {
                  for (; (uVar177 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
                  }
                }
                uVar162 = *(ulong *)(uVar161 + lVar170 * 8);
                iVar166 = tNear.field_0.i[lVar170];
                auVar258._8_4_ = iVar166;
                auVar258._0_8_ = uVar162;
                auVar258._12_4_ = 0;
                auVar279._8_4_ = -(uint)((int)uVar158 < (int)uVar172);
                uVar177 = uVar177 - 1 & uVar177;
                fVar368 = local_1268;
                fVar343 = fStack_1264;
                fVar195 = fStack_1260;
                fVar196 = fStack_125c;
                if (uVar177 == 0) {
                  auVar279._4_4_ = auVar279._8_4_;
                  auVar279._0_4_ = auVar279._8_4_;
                  auVar279._12_4_ = auVar279._8_4_;
                  auVar235 = auVar198 & auVar279 | ~auVar279 & auVar236;
                  auVar297 = auVar236 & auVar279 | ~auVar279 & auVar198;
                  auVar280._8_4_ = -(uint)(auVar235._8_4_ < iVar166);
                  auVar280._0_8_ = CONCAT44(auVar280._8_4_,auVar280._8_4_);
                  auVar280._12_4_ = auVar280._8_4_;
                  uVar162 = ~auVar280._0_8_ & uVar162 | auVar235._0_8_ & auVar280._0_8_;
                  auVar235 = auVar258 & auVar280 | ~auVar280 & auVar235;
                  auVar199._8_4_ = -(uint)(auVar297._8_4_ < auVar235._8_4_);
                  auVar199._4_4_ = auVar199._8_4_;
                  auVar199._0_4_ = auVar199._8_4_;
                  auVar199._12_4_ = auVar199._8_4_;
                  *local_1440 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar199 & auVar297 | auVar235 & auVar199);
                  local_1440[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)
                       (auVar297 & auVar199 | ~auVar199 & auVar235);
                  local_1440 = local_1440 + 2;
                }
                else {
                  lVar170 = 0;
                  if (uVar177 != 0) {
                    for (; (uVar177 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
                    }
                  }
                  iVar19 = tNear.field_0.i[lVar170];
                  auVar298._8_4_ = iVar19;
                  auVar298._0_8_ = *(undefined8 *)(uVar161 + lVar170 * 8);
                  auVar298._12_4_ = 0;
                  auVar281._4_4_ = auVar279._8_4_;
                  auVar281._0_4_ = auVar279._8_4_;
                  auVar281._8_4_ = auVar279._8_4_;
                  auVar281._12_4_ = auVar279._8_4_;
                  auVar235 = auVar198 & auVar281 | ~auVar281 & auVar236;
                  auVar297 = auVar236 & auVar281 | ~auVar281 & auVar198;
                  auVar306._0_4_ = -(uint)(iVar166 < iVar19);
                  auVar306._4_4_ = -(uint)(iVar166 < iVar19);
                  auVar306._8_4_ = -(uint)(iVar166 < iVar19);
                  auVar306._12_4_ = -(uint)(iVar166 < iVar19);
                  auVar277 = auVar258 & auVar306 | ~auVar306 & auVar298;
                  auVar307 = ~auVar306 & auVar258 | auVar298 & auVar306;
                  auVar259._8_4_ = -(uint)(auVar297._8_4_ < auVar307._8_4_);
                  auVar259._4_4_ = auVar259._8_4_;
                  auVar259._0_4_ = auVar259._8_4_;
                  auVar259._12_4_ = auVar259._8_4_;
                  auVar309 = auVar297 & auVar259 | ~auVar259 & auVar307;
                  auVar237._8_4_ = -(uint)(auVar235._8_4_ < auVar277._8_4_);
                  auVar237._0_8_ = CONCAT44(auVar237._8_4_,auVar237._8_4_);
                  auVar237._12_4_ = auVar237._8_4_;
                  uVar162 = auVar235._0_8_ & auVar237._0_8_ | ~auVar237._0_8_ & auVar277._0_8_;
                  auVar235 = ~auVar237 & auVar235 | auVar277 & auVar237;
                  auVar200._8_4_ = -(uint)(auVar235._8_4_ < auVar309._8_4_);
                  auVar200._4_4_ = auVar200._8_4_;
                  auVar200._0_4_ = auVar200._8_4_;
                  auVar200._12_4_ = auVar200._8_4_;
                  *local_1440 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar259 & auVar297 | auVar307 & auVar259);
                  local_1440[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar200 & auVar235 | auVar309 & auVar200);
                  local_1440[2] =
                       (StackItemT<embree::NodeRefPtr<4>_>)
                       (auVar235 & auVar200 | ~auVar200 & auVar309);
                  local_1440 = local_1440 + 3;
                  fVar365 = local_1228;
                  fVar275 = fStack_1224;
                  fVar294 = fStack_1220;
                  fVar379 = fStack_121c;
                  fVar295 = local_1238;
                  fVar346 = fStack_1234;
                  fVar257 = fStack_1230;
                  fVar325 = fStack_122c;
                }
              }
            }
          }
        }
        else {
          iVar159 = 6;
        }
      } while (iVar159 == 0);
      if (iVar159 == 6) {
        local_1198 = (ulong)((uint)uVar162 & 0xf) - 8;
        if (local_1198 != 0) {
          uVar162 = uVar162 & 0xfffffffffffffff0;
          lVar170 = 0;
          do {
            local_13b8 = lVar170 * 0x90;
            fVar257 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar162 + 0x80 + local_13b8)) *
                      *(float *)(uVar162 + 0x84 + local_13b8);
            uVar158 = *(uint *)(uVar162 + 0x24 + local_13b8);
            auVar235 = *(undefined1 (*) [16])(uVar162 + 0x20 + local_13b8);
            auVar297 = *(undefined1 (*) [16])(uVar162 + 0x30 + local_13b8);
            bVar29 = (byte)uVar158;
            bVar193 = auVar235[0];
            bVar30 = (byte)(uVar158 >> 8);
            bVar220 = auVar235[1];
            bVar31 = (byte)(uVar158 >> 0x10);
            bVar222 = auVar235[2];
            bVar32 = (byte)(uVar158 >> 0x18);
            bVar224 = auVar235[3];
            cVar226 = auVar235[4];
            cVar228 = auVar235[5];
            cVar230 = auVar235[6];
            cVar233 = auVar235[7];
            cVar194 = -((byte)((bVar29 < bVar193) * bVar29 | (bVar29 >= bVar193) * bVar193) ==
                       bVar193);
            cVar221 = -((byte)((bVar30 < bVar220) * bVar30 | (bVar30 >= bVar220) * bVar220) ==
                       bVar220);
            cVar223 = -((byte)((bVar31 < bVar222) * bVar31 | (bVar31 >= bVar222) * bVar222) ==
                       bVar222);
            cVar225 = -((byte)((bVar32 < bVar224) * bVar32 | (bVar32 >= bVar224) * bVar224) ==
                       bVar224);
            cVar227 = -((char)((cVar226 == '\0') * cVar226) == cVar226);
            cVar229 = -((char)((cVar228 == '\0') * cVar228) == cVar228);
            cVar231 = -((char)((cVar230 == '\0') * cVar230) == cVar230);
            cVar234 = -((char)((cVar233 == '\0') * cVar233) == cVar233);
            auVar43[0xd] = 0;
            auVar43._0_13_ = auVar235._0_13_;
            auVar43[0xe] = cVar233;
            auVar50[0xc] = cVar230;
            auVar50._0_12_ = auVar235._0_12_;
            auVar50._13_2_ = auVar43._13_2_;
            auVar56[0xb] = 0;
            auVar56._0_11_ = auVar235._0_11_;
            auVar56._12_3_ = auVar50._12_3_;
            auVar67[10] = cVar228;
            auVar67._0_10_ = auVar235._0_10_;
            auVar67._11_4_ = auVar56._11_4_;
            auVar73[9] = 0;
            auVar73._0_9_ = auVar235._0_9_;
            auVar73._10_5_ = auVar67._10_5_;
            auVar79[8] = cVar226;
            auVar79._0_8_ = auVar235._0_8_;
            auVar79._9_6_ = auVar73._9_6_;
            auVar113._7_8_ = 0;
            auVar113._0_7_ = auVar79._8_7_;
            Var114 = CONCAT81(SUB158(auVar113 << 0x40,7),bVar224);
            auVar141._9_6_ = 0;
            auVar141._0_9_ = Var114;
            auVar115._1_10_ = SUB1510(auVar141 << 0x30,5);
            auVar115[0] = bVar222;
            auVar142._11_4_ = 0;
            auVar142._0_11_ = auVar115;
            auVar116._1_12_ = SUB1512(auVar142 << 0x20,3);
            auVar116[0] = bVar220;
            auVar107._2_13_ = auVar116;
            auVar107._0_2_ = CONCAT11(0,bVar193);
            auVar44._10_2_ = 0;
            auVar44._0_10_ = auVar107._0_10_;
            auVar44._12_2_ = (short)Var114;
            uVar153 = CONCAT42(auVar44._10_4_,auVar115._0_2_);
            auVar117._6_8_ = 0;
            auVar117._0_6_ = uVar153;
            fVar368 = *(float *)(uVar162 + 0x44 + local_13b8);
            fVar343 = *(float *)(uVar162 + 0x38 + local_13b8);
            fVar325 = (float)CONCAT11(0,bVar193) * fVar368 + fVar343;
            fVar334 = (float)(int)CONCAT82(SUB148(auVar117 << 0x40,6),auVar116._0_2_) * fVar368 +
                      fVar343;
            fVar338 = (float)(int)uVar153 * fVar368 + fVar343;
            fVar342 = (float)(auVar44._10_4_ >> 0x10) * fVar368 + fVar343;
            auVar235 = *(undefined1 (*) [16])(uVar162 + 0x50 + local_13b8);
            auVar33[0xd] = 0;
            auVar33._0_13_ = auVar235._0_13_;
            auVar33[0xe] = auVar235[7];
            auVar45[0xc] = auVar235[6];
            auVar45._0_12_ = auVar235._0_12_;
            auVar45._13_2_ = auVar33._13_2_;
            auVar51[0xb] = 0;
            auVar51._0_11_ = auVar235._0_11_;
            auVar51._12_3_ = auVar45._12_3_;
            auVar57[10] = auVar235[5];
            auVar57._0_10_ = auVar235._0_10_;
            auVar57._11_4_ = auVar51._11_4_;
            auVar68[9] = 0;
            auVar68._0_9_ = auVar235._0_9_;
            auVar68._10_5_ = auVar57._10_5_;
            auVar74[8] = auVar235[4];
            auVar74._0_8_ = auVar235._0_8_;
            auVar74._9_6_ = auVar68._9_6_;
            auVar118._7_8_ = 0;
            auVar118._0_7_ = auVar74._8_7_;
            Var114 = CONCAT81(SUB158(auVar118 << 0x40,7),auVar235[3]);
            auVar143._9_6_ = 0;
            auVar143._0_9_ = Var114;
            auVar119._1_10_ = SUB1510(auVar143 << 0x30,5);
            auVar119[0] = auVar235[2];
            auVar144._11_4_ = 0;
            auVar144._0_11_ = auVar119;
            auVar97[2] = auVar235[1];
            auVar97._0_2_ = auVar235._0_2_;
            auVar97._3_12_ = SUB1512(auVar144 << 0x20,3);
            auVar102._2_13_ = auVar97._2_13_;
            auVar102._0_2_ = auVar235._0_2_ & 0xff;
            auVar34._10_2_ = 0;
            auVar34._0_10_ = auVar102._0_10_;
            auVar34._12_2_ = (short)Var114;
            uVar153 = CONCAT42(auVar34._10_4_,auVar119._0_2_);
            auVar120._6_8_ = 0;
            auVar120._0_6_ = uVar153;
            auVar58._4_2_ = auVar97._2_2_;
            auVar58._0_4_ = auVar102._0_4_;
            auVar58._6_8_ = SUB148(auVar120 << 0x40,6);
            fVar195 = *(float *)(uVar162 + 0x74 + local_13b8);
            fVar196 = *(float *)(uVar162 + 0x68 + local_13b8);
            auVar80[0xc] = bVar32;
            auVar80._0_12_ = ZEXT812(0);
            auVar81._10_3_ = auVar80._10_3_;
            auVar81._0_10_ = (unkuint10)bVar31 << 0x40;
            fVar326 = (float)(uVar158 & 0xff) * fVar368 + fVar343;
            fVar335 = (float)bVar30 * fVar368 + fVar343;
            fVar339 = (float)auVar81._8_4_ * fVar368 + fVar343;
            fVar343 = (float)(uint3)(auVar80._10_3_ >> 0x10) * fVar368 + fVar343;
            uVar157 = *(undefined4 *)(uVar162 + 0x54 + local_13b8);
            uVar175 = (ulong)(ushort)uVar157 & 0xffffffffffff00ff;
            auVar82._8_4_ = 0;
            auVar82._0_8_ = uVar175;
            auVar82[0xc] = (char)((uint)uVar157 >> 0x18);
            auVar83[8] = (char)((uint)uVar157 >> 0x10);
            auVar83._0_8_ = uVar175;
            auVar83[9] = 0;
            auVar83._10_3_ = auVar82._10_3_;
            auVar121._5_8_ = 0;
            auVar121._0_5_ = auVar83._8_5_;
            auVar84[4] = (char)((uint)uVar157 >> 8);
            auVar84._0_4_ = (int)uVar175;
            auVar84[5] = 0;
            auVar84._6_7_ = SUB137(auVar121 << 0x40,6);
            uVar161 = *(ulong *)(uVar162 + 0x28 + local_13b8);
            auVar35._8_6_ = 0;
            auVar35._0_8_ = uVar161;
            auVar35[0xe] = (char)(uVar161 >> 0x38);
            auVar46._8_4_ = 0;
            auVar46._0_8_ = uVar161;
            auVar46[0xc] = (char)(uVar161 >> 0x30);
            auVar46._13_2_ = auVar35._13_2_;
            auVar52._8_4_ = 0;
            auVar52._0_8_ = uVar161;
            auVar52._12_3_ = auVar46._12_3_;
            auVar59._8_2_ = 0;
            auVar59._0_8_ = uVar161;
            auVar59[10] = (char)(uVar161 >> 0x28);
            auVar59._11_4_ = auVar52._11_4_;
            auVar69._8_2_ = 0;
            auVar69._0_8_ = uVar161;
            auVar69._10_5_ = auVar59._10_5_;
            auVar75[8] = (char)(uVar161 >> 0x20);
            auVar75._0_8_ = uVar161;
            auVar75._9_6_ = auVar69._9_6_;
            auVar122._7_8_ = 0;
            auVar122._0_7_ = auVar75._8_7_;
            Var114 = CONCAT81(SUB158(auVar122 << 0x40,7),(char)(uVar161 >> 0x18));
            auVar145._9_6_ = 0;
            auVar145._0_9_ = Var114;
            auVar123._1_10_ = SUB1510(auVar145 << 0x30,5);
            auVar123[0] = (char)(uVar161 >> 0x10);
            auVar146._11_4_ = 0;
            auVar146._0_11_ = auVar123;
            auVar98[2] = (char)(uVar161 >> 8);
            auVar98._0_2_ = (ushort)uVar161;
            auVar98._3_12_ = SUB1512(auVar146 << 0x20,3);
            auVar103._2_13_ = auVar98._2_13_;
            auVar103._0_2_ = (ushort)uVar161 & 0xff;
            auVar36._10_2_ = 0;
            auVar36._0_10_ = auVar103._0_10_;
            auVar36._12_2_ = (short)Var114;
            uVar154 = CONCAT42(auVar36._10_4_,auVar123._0_2_);
            auVar124._6_8_ = 0;
            auVar124._0_6_ = uVar154;
            auVar60._4_2_ = auVar98._2_2_;
            auVar60._0_4_ = auVar103._0_4_;
            auVar60._6_8_ = SUB148(auVar124 << 0x40,6);
            fVar368 = *(float *)(uVar162 + 0x48 + local_13b8);
            fVar365 = *(float *)(uVar162 + 0x3c + local_13b8);
            fVar350 = (float)(auVar103._0_4_ & 0xffff) * fVar368 + fVar365;
            fVar355 = (float)auVar60._4_4_ * fVar368 + fVar365;
            fVar359 = (float)(int)uVar154 * fVar368 + fVar365;
            fVar364 = (float)(auVar36._10_4_ >> 0x10) * fVar368 + fVar365;
            uVar161 = *(ulong *)(uVar162 + 0x58 + local_13b8);
            auVar37._8_6_ = 0;
            auVar37._0_8_ = uVar161;
            auVar37[0xe] = (char)(uVar161 >> 0x38);
            auVar47._8_4_ = 0;
            auVar47._0_8_ = uVar161;
            auVar47[0xc] = (char)(uVar161 >> 0x30);
            auVar47._13_2_ = auVar37._13_2_;
            auVar53._8_4_ = 0;
            auVar53._0_8_ = uVar161;
            auVar53._12_3_ = auVar47._12_3_;
            auVar61._8_2_ = 0;
            auVar61._0_8_ = uVar161;
            auVar61[10] = (char)(uVar161 >> 0x28);
            auVar61._11_4_ = auVar53._11_4_;
            auVar70._8_2_ = 0;
            auVar70._0_8_ = uVar161;
            auVar70._10_5_ = auVar61._10_5_;
            auVar76[8] = (char)(uVar161 >> 0x20);
            auVar76._0_8_ = uVar161;
            auVar76._9_6_ = auVar70._9_6_;
            auVar125._7_8_ = 0;
            auVar125._0_7_ = auVar76._8_7_;
            Var114 = CONCAT81(SUB158(auVar125 << 0x40,7),(char)(uVar161 >> 0x18));
            auVar147._9_6_ = 0;
            auVar147._0_9_ = Var114;
            auVar126._1_10_ = SUB1510(auVar147 << 0x30,5);
            auVar126[0] = (char)(uVar161 >> 0x10);
            auVar148._11_4_ = 0;
            auVar148._0_11_ = auVar126;
            auVar99[2] = (char)(uVar161 >> 8);
            auVar99._0_2_ = (ushort)uVar161;
            auVar99._3_12_ = SUB1512(auVar148 << 0x20,3);
            auVar104._2_13_ = auVar99._2_13_;
            auVar104._0_2_ = (ushort)uVar161 & 0xff;
            auVar38._10_2_ = 0;
            auVar38._0_10_ = auVar104._0_10_;
            auVar38._12_2_ = (short)Var114;
            uVar154 = CONCAT42(auVar38._10_4_,auVar126._0_2_);
            auVar127._6_8_ = 0;
            auVar127._0_6_ = uVar154;
            auVar62._4_2_ = auVar99._2_2_;
            auVar62._0_4_ = auVar104._0_4_;
            auVar62._6_8_ = SUB148(auVar127 << 0x40,6);
            fVar275 = *(float *)(uVar162 + 0x78 + local_13b8);
            fVar294 = *(float *)(uVar162 + 0x6c + local_13b8);
            uVar157 = *(undefined4 *)(uVar162 + 0x2c + local_13b8);
            uVar161 = (ulong)(ushort)uVar157 & 0xffffffffffff00ff;
            auVar85._8_4_ = 0;
            auVar85._0_8_ = uVar161;
            auVar85[0xc] = (char)((uint)uVar157 >> 0x18);
            auVar86[8] = (char)((uint)uVar157 >> 0x10);
            auVar86._0_8_ = uVar161;
            auVar86[9] = 0;
            auVar86._10_3_ = auVar85._10_3_;
            auVar128._5_8_ = 0;
            auVar128._0_5_ = auVar86._8_5_;
            auVar87[4] = (char)((uint)uVar157 >> 8);
            auVar87._0_4_ = (int)uVar161;
            auVar87[5] = 0;
            auVar87._6_7_ = SUB137(auVar128 << 0x40,6);
            fVar351 = (float)(int)uVar161 * fVar368 + fVar365;
            fVar356 = (float)auVar87._4_4_ * fVar368 + fVar365;
            fVar360 = (float)auVar86._8_4_ * fVar368 + fVar365;
            fVar365 = (float)(uint3)(auVar85._10_3_ >> 0x10) * fVar368 + fVar365;
            uVar157 = *(undefined4 *)(uVar162 + 0x5c + local_13b8);
            uVar161 = (ulong)(ushort)uVar157 & 0xffffffffffff00ff;
            auVar88._8_4_ = 0;
            auVar88._0_8_ = uVar161;
            auVar88[0xc] = (char)((uint)uVar157 >> 0x18);
            auVar89[8] = (char)((uint)uVar157 >> 0x10);
            auVar89._0_8_ = uVar161;
            auVar89[9] = 0;
            auVar89._10_3_ = auVar88._10_3_;
            auVar129._5_8_ = 0;
            auVar129._0_5_ = auVar89._8_5_;
            auVar90[4] = (char)((uint)uVar157 >> 8);
            auVar90._0_4_ = (int)uVar161;
            auVar90[5] = 0;
            auVar90._6_7_ = SUB137(auVar129 << 0x40,6);
            auVar39[0xd] = 0;
            auVar39._0_13_ = auVar297._0_13_;
            auVar39[0xe] = auVar297[7];
            auVar48[0xc] = auVar297[6];
            auVar48._0_12_ = auVar297._0_12_;
            auVar48._13_2_ = auVar39._13_2_;
            auVar54[0xb] = 0;
            auVar54._0_11_ = auVar297._0_11_;
            auVar54._12_3_ = auVar48._12_3_;
            auVar63[10] = auVar297[5];
            auVar63._0_10_ = auVar297._0_10_;
            auVar63._11_4_ = auVar54._11_4_;
            auVar71[9] = 0;
            auVar71._0_9_ = auVar297._0_9_;
            auVar71._10_5_ = auVar63._10_5_;
            auVar77[8] = auVar297[4];
            auVar77._0_8_ = auVar297._0_8_;
            auVar77._9_6_ = auVar71._9_6_;
            auVar130._7_8_ = 0;
            auVar130._0_7_ = auVar77._8_7_;
            Var114 = CONCAT81(SUB158(auVar130 << 0x40,7),auVar297[3]);
            auVar149._9_6_ = 0;
            auVar149._0_9_ = Var114;
            auVar131._1_10_ = SUB1510(auVar149 << 0x30,5);
            auVar131[0] = auVar297[2];
            auVar150._11_4_ = 0;
            auVar150._0_11_ = auVar131;
            auVar100[2] = auVar297[1];
            auVar100._0_2_ = auVar297._0_2_;
            auVar100._3_12_ = SUB1512(auVar150 << 0x20,3);
            auVar105._2_13_ = auVar100._2_13_;
            auVar105._0_2_ = auVar297._0_2_ & 0xff;
            auVar40._10_2_ = 0;
            auVar40._0_10_ = auVar105._0_10_;
            auVar40._12_2_ = (short)Var114;
            uVar155 = CONCAT42(auVar40._10_4_,auVar131._0_2_);
            auVar132._6_8_ = 0;
            auVar132._0_6_ = uVar155;
            auVar64._4_2_ = auVar100._2_2_;
            auVar64._0_4_ = auVar105._0_4_;
            auVar64._6_8_ = SUB148(auVar132 << 0x40,6);
            fVar368 = *(float *)(uVar162 + 0x4c + local_13b8);
            fVar379 = *(float *)(uVar162 + 0x40 + local_13b8);
            fVar369 = (float)(auVar105._0_4_ & 0xffff) * fVar368 + fVar379;
            fVar372 = (float)auVar64._4_4_ * fVar368 + fVar379;
            fVar375 = (float)(int)uVar155 * fVar368 + fVar379;
            fVar378 = (float)(auVar40._10_4_ >> 0x10) * fVar368 + fVar379;
            auVar235 = *(undefined1 (*) [16])(uVar162 + 0x60 + local_13b8);
            auVar41[0xd] = 0;
            auVar41._0_13_ = auVar235._0_13_;
            auVar41[0xe] = auVar235[7];
            auVar49[0xc] = auVar235[6];
            auVar49._0_12_ = auVar235._0_12_;
            auVar49._13_2_ = auVar41._13_2_;
            auVar55[0xb] = 0;
            auVar55._0_11_ = auVar235._0_11_;
            auVar55._12_3_ = auVar49._12_3_;
            auVar65[10] = auVar235[5];
            auVar65._0_10_ = auVar235._0_10_;
            auVar65._11_4_ = auVar55._11_4_;
            auVar72[9] = 0;
            auVar72._0_9_ = auVar235._0_9_;
            auVar72._10_5_ = auVar65._10_5_;
            auVar78[8] = auVar235[4];
            auVar78._0_8_ = auVar235._0_8_;
            auVar78._9_6_ = auVar72._9_6_;
            auVar133._7_8_ = 0;
            auVar133._0_7_ = auVar78._8_7_;
            Var114 = CONCAT81(SUB158(auVar133 << 0x40,7),auVar235[3]);
            auVar151._9_6_ = 0;
            auVar151._0_9_ = Var114;
            auVar134._1_10_ = SUB1510(auVar151 << 0x30,5);
            auVar134[0] = auVar235[2];
            auVar152._11_4_ = 0;
            auVar152._0_11_ = auVar134;
            auVar101[2] = auVar235[1];
            auVar101._0_2_ = auVar235._0_2_;
            auVar101._3_12_ = SUB1512(auVar152 << 0x20,3);
            auVar106._2_13_ = auVar101._2_13_;
            auVar106._0_2_ = auVar235._0_2_ & 0xff;
            auVar42._10_2_ = 0;
            auVar42._0_10_ = auVar106._0_10_;
            auVar42._12_2_ = (short)Var114;
            uVar155 = CONCAT42(auVar42._10_4_,auVar134._0_2_);
            auVar135._6_8_ = 0;
            auVar135._0_6_ = uVar155;
            auVar66._4_2_ = auVar101._2_2_;
            auVar66._0_4_ = auVar106._0_4_;
            auVar66._6_8_ = SUB148(auVar135 << 0x40,6);
            fVar295 = *(float *)(uVar162 + 0x7c + local_13b8);
            fVar346 = *(float *)(uVar162 + 0x70 + local_13b8);
            uVar157 = *(undefined4 *)(uVar162 + 0x34 + local_13b8);
            uVar177 = (ulong)(ushort)uVar157 & 0xffffffffffff00ff;
            auVar91._8_4_ = 0;
            auVar91._0_8_ = uVar177;
            auVar91[0xc] = (char)((uint)uVar157 >> 0x18);
            auVar92[8] = (char)((uint)uVar157 >> 0x10);
            auVar92._0_8_ = uVar177;
            auVar92[9] = 0;
            auVar92._10_3_ = auVar91._10_3_;
            auVar136._5_8_ = 0;
            auVar136._0_5_ = auVar92._8_5_;
            auVar93[4] = (char)((uint)uVar157 >> 8);
            auVar93._0_4_ = (int)uVar177;
            auVar93[5] = 0;
            auVar93._6_7_ = SUB137(auVar136 << 0x40,6);
            fVar370 = (float)(int)uVar177 * fVar368 + fVar379;
            fVar373 = (float)auVar93._4_4_ * fVar368 + fVar379;
            fVar376 = (float)auVar92._8_4_ * fVar368 + fVar379;
            fVar379 = (float)(uint3)(auVar91._10_3_ >> 0x10) * fVar368 + fVar379;
            uVar157 = *(undefined4 *)(uVar162 + 100 + local_13b8);
            uVar177 = (ulong)(ushort)uVar157 & 0xffffffffffff00ff;
            auVar94._8_4_ = 0;
            auVar94._0_8_ = uVar177;
            auVar94[0xc] = (char)((uint)uVar157 >> 0x18);
            auVar95[8] = (char)((uint)uVar157 >> 0x10);
            auVar95._0_8_ = uVar177;
            auVar95[9] = 0;
            auVar95._10_3_ = auVar94._10_3_;
            auVar137._5_8_ = 0;
            auVar137._0_5_ = auVar95._8_5_;
            auVar96[4] = (char)((uint)uVar157 >> 8);
            auVar96._0_4_ = (int)uVar177;
            auVar96[5] = 0;
            auVar96._6_7_ = SUB137(auVar137 << 0x40,6);
            auVar238._0_8_ =
                 CONCAT44((((((float)auVar58._4_4_ * fVar195 + fVar196) - fVar334) * fVar257 +
                           fVar334) - fStack_1224) * fStack_1104,
                          (((((float)(auVar102._0_4_ & 0xffff) * fVar195 + fVar196) - fVar325) *
                            fVar257 + fVar325) - local_1228) * local_1108);
            auVar238._8_4_ =
                 (((((float)(int)uVar153 * fVar195 + fVar196) - fVar338) * fVar257 + fVar338) -
                 fStack_1220) * fStack_1100;
            auVar238._12_4_ =
                 (((((float)(auVar34._10_4_ >> 0x10) * fVar195 + fVar196) - fVar342) * fVar257 +
                  fVar342) - fStack_121c) * fStack_10fc;
            auVar299._0_8_ =
                 CONCAT44((((((float)auVar62._4_4_ * fVar275 + fVar294) - fVar355) * fVar257 +
                           fVar355) - fStack_1234) * (float)local_1118._4_4_,
                          (((((float)(auVar104._0_4_ & 0xffff) * fVar275 + fVar294) - fVar350) *
                            fVar257 + fVar350) - local_1238) * (float)local_1118._0_4_);
            auVar299._8_4_ =
                 (((((float)(int)uVar154 * fVar275 + fVar294) - fVar359) * fVar257 + fVar359) -
                 fStack_1230) * fStack_1110;
            auVar299._12_4_ =
                 (((((float)(auVar38._10_4_ >> 0x10) * fVar275 + fVar294) - fVar364) * fVar257 +
                  fVar364) - fStack_122c) * fStack_110c;
            auVar282._0_4_ =
                 (((((float)(int)uVar175 * fVar195 + fVar196) - fVar326) * fVar257 + fVar326) -
                 local_1228) * local_1138;
            auVar282._4_4_ =
                 (((((float)auVar84._4_4_ * fVar195 + fVar196) - fVar335) * fVar257 + fVar335) -
                 fStack_1224) * fStack_1134;
            auVar282._8_4_ =
                 (((((float)auVar83._8_4_ * fVar195 + fVar196) - fVar339) * fVar257 + fVar339) -
                 fStack_1220) * fStack_1130;
            auVar282._12_4_ =
                 (((((float)(uint3)(auVar82._10_3_ >> 0x10) * fVar195 + fVar196) - fVar343) *
                   fVar257 + fVar343) - fStack_121c) * fStack_112c;
            auVar320._0_4_ =
                 (((((float)(int)uVar161 * fVar275 + fVar294) - fVar351) * fVar257 + fVar351) -
                 local_1238) * (float)local_10d8._0_4_;
            auVar320._4_4_ =
                 (((((float)auVar90._4_4_ * fVar275 + fVar294) - fVar356) * fVar257 + fVar356) -
                 fStack_1234) * (float)local_10d8._4_4_;
            auVar320._8_4_ =
                 (((((float)auVar89._8_4_ * fVar275 + fVar294) - fVar360) * fVar257 + fVar360) -
                 fStack_1230) * fStack_10d0;
            auVar320._12_4_ =
                 (((((float)(uint3)(auVar88._10_3_ >> 0x10) * fVar275 + fVar294) - fVar365) *
                   fVar257 + fVar365) - fStack_122c) * fStack_10cc;
            auVar260._8_4_ = auVar238._8_4_;
            auVar260._0_8_ = auVar238._0_8_;
            auVar260._12_4_ = auVar238._12_4_;
            auVar297 = minps(auVar260,auVar282);
            auVar235 = maxps(auVar238,auVar282);
            auVar283._8_4_ = auVar299._8_4_;
            auVar283._0_8_ = auVar299._0_8_;
            auVar283._12_4_ = auVar299._12_4_;
            auVar277 = minps(auVar283,auVar320);
            auVar297 = maxps(auVar297,auVar277);
            auVar277 = maxps(auVar299,auVar320);
            auVar308._0_8_ =
                 CONCAT44((((((float)auVar66._4_4_ * fVar295 + fVar346) - fVar372) * fVar257 +
                           fVar372) - fStack_1264) * fStack_10f4,
                          (((((float)(auVar106._0_4_ & 0xffff) * fVar295 + fVar346) - fVar369) *
                            fVar257 + fVar369) - local_1268) * local_10f8);
            auVar308._8_4_ =
                 (((((float)(int)uVar155 * fVar295 + fVar346) - fVar375) * fVar257 + fVar375) -
                 fStack_1260) * fStack_10f0;
            auVar308._12_4_ =
                 (((((float)(auVar42._10_4_ >> 0x10) * fVar295 + fVar346) - fVar378) * fVar257 +
                  fVar378) - fStack_125c) * fStack_10ec;
            auVar329._0_4_ =
                 (((((float)(int)uVar177 * fVar295 + fVar346) - fVar370) * fVar257 + fVar370) -
                 local_1268) * (float)local_10e8._0_4_;
            auVar329._4_4_ =
                 (((((float)auVar96._4_4_ * fVar295 + fVar346) - fVar373) * fVar257 + fVar373) -
                 fStack_1264) * (float)local_10e8._4_4_;
            auVar329._8_4_ =
                 (((((float)auVar95._8_4_ * fVar295 + fVar346) - fVar376) * fVar257 + fVar376) -
                 fStack_1260) * fStack_10e0;
            auVar329._12_4_ =
                 (((((float)(uint3)(auVar94._10_3_ >> 0x10) * fVar295 + fVar346) - fVar379) *
                   fVar257 + fVar379) - fStack_125c) * fStack_10dc;
            auVar235 = minps(auVar235,auVar277);
            auVar284._8_4_ = auVar308._8_4_;
            auVar284._0_8_ = auVar308._0_8_;
            auVar284._12_4_ = auVar308._12_4_;
            auVar277 = minps(auVar284,auVar329);
            auVar309 = maxps(auVar308,auVar329);
            auVar112._4_4_ = iStack_1124;
            auVar112._0_4_ = local_1128;
            auVar112._8_4_ = iStack_1120;
            auVar112._12_4_ = iStack_111c;
            auVar277 = maxps(auVar277,auVar112);
            dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar297,auVar277);
            auVar110._4_4_ = iStack_1214;
            auVar110._0_4_ = local_1218;
            auVar110._8_4_ = iStack_1210;
            auVar110._12_4_ = iStack_120c;
            auVar297 = minps(auVar309,auVar110);
            auVar235 = minps(auVar235,auVar297);
            auVar261._0_4_ = -(uint)(auVar235._0_4_ < dist.field_0._0_4_);
            auVar261._4_4_ = -(uint)(auVar235._4_4_ < dist.field_0._4_4_);
            auVar261._8_4_ = -(uint)(auVar235._8_4_ < dist.field_0._8_4_);
            auVar261._12_4_ = -(uint)(auVar235._12_4_ < dist.field_0._12_4_);
            Var140 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(
                                                  CONCAT11(cVar234,cVar234),cVar231),cVar231),
                                                  cVar229),cVar229),cVar227),
                                                  CONCAT11(cVar227,cVar234)) >> 8),cVar225),cVar225)
            ;
            auVar139._2_10_ = Var140;
            auVar139[1] = cVar223;
            auVar139[0] = cVar223;
            auVar138._2_12_ = auVar139;
            auVar138[1] = cVar221;
            auVar138[0] = cVar221;
            auVar201._0_2_ = CONCAT11(cVar194,cVar194);
            auVar201._2_14_ = auVar138;
            uVar232 = (undefined2)Var140;
            auVar205._0_12_ = auVar201._0_12_;
            auVar205._12_2_ = uVar232;
            auVar205._14_2_ = uVar232;
            auVar204._12_4_ = auVar205._12_4_;
            auVar204._0_10_ = auVar201._0_10_;
            auVar204._10_2_ = auVar139._0_2_;
            auVar203._10_6_ = auVar204._10_6_;
            auVar203._0_8_ = auVar201._0_8_;
            auVar203._8_2_ = auVar139._0_2_;
            auVar202._8_8_ = auVar203._8_8_;
            auVar202._6_2_ = auVar138._0_2_;
            auVar202._4_2_ = auVar138._0_2_;
            auVar202._2_2_ = auVar201._0_2_;
            auVar202._0_2_ = auVar201._0_2_;
            uVar158 = movmskps((int)uVar162,~auVar261 & auVar202);
            if (uVar158 != 0) {
              local_13b8 = local_13b8 + uVar162;
              local_1140 = (ulong)(uVar158 & 0xff);
              local_1158 = lVar170;
              do {
                lVar180 = 0;
                if (local_1140 != 0) {
                  for (; (local_1140 >> lVar180 & 1) == 0; lVar180 = lVar180 + 1) {
                  }
                }
                local_11e8 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
                if (dist.field_0.v[lVar180] <= *(float *)(ray + k * 4 + 0x80)) {
                  uVar17 = *(ushort *)(local_13b8 + lVar180 * 8);
                  uVar18 = *(ushort *)(local_13b8 + 2 + lVar180 * 8);
                  local_13a0 = (ulong)*(uint *)(local_13b8 + 0x88);
                  local_13a8 = (ulong)*(uint *)(local_13b8 + 4 + lVar180 * 8);
                  local_1150 = context->scene;
                  pGVar20 = (local_1150->geometries).items[local_13a0].ptr;
                  lVar178 = local_13a8 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i;
                  lVar180 = *(long *)&pGVar20->field_0x58;
                  fVar368 = pGVar20->fnumTimeSegments;
                  fVar343 = (pGVar20->time_range).lower;
                  auVar239._0_4_ = (pGVar20->time_range).upper - fVar343;
                  auVar285._0_4_ = *(float *)(ray + 0x70) - fVar343;
                  auVar285._4_4_ = *(float *)(ray + 0x74) - fVar343;
                  auVar285._8_4_ = *(float *)(ray + 0x78) - fVar343;
                  auVar285._12_4_ = *(float *)(ray + 0x7c) - fVar343;
                  auVar239._4_4_ = auVar239._0_4_;
                  auVar239._8_4_ = auVar239._0_4_;
                  auVar239._12_4_ = auVar239._0_4_;
                  auVar235 = divps(auVar285,auVar239);
                  fVar275 = auVar235._0_4_ * fVar368;
                  fVar294 = auVar235._4_4_ * fVar368;
                  fVar379 = auVar235._8_4_ * fVar368;
                  fVar295 = auVar235._12_4_ * fVar368;
                  fVar343 = floorf(fVar379);
                  fVar195 = floorf(fVar295);
                  fVar196 = floorf(fVar275);
                  fVar365 = floorf(fVar294);
                  auVar235 = _local_11d8;
                  auVar240._4_4_ = fVar365;
                  auVar240._0_4_ = fVar196;
                  auVar240._8_4_ = fVar343;
                  auVar240._12_4_ = fVar195;
                  auVar206._0_4_ = fVar368 + -1.0;
                  auVar206._4_4_ = auVar206._0_4_;
                  auVar206._8_4_ = auVar206._0_4_;
                  auVar206._12_4_ = auVar206._0_4_;
                  auVar297 = minps(auVar240,auVar206);
                  auVar297 = maxps(auVar297,_DAT_01feba10);
                  ftime.field_0.v[0] = fVar275 - auVar297._0_4_;
                  ftime.field_0.v[1] = fVar294 - auVar297._4_4_;
                  ftime.field_0.v[2] = fVar379 - auVar297._8_4_;
                  ftime.field_0.v[3] = fVar295 - auVar297._12_4_;
                  itime.field_0.i[0] = (int)auVar297._0_4_;
                  itime.field_0.i[1] = (int)auVar297._4_4_;
                  itime.field_0.i[2] = (int)auVar297._8_4_;
                  itime.field_0.i[3] = (int)auVar297._12_4_;
                  uVar174 = uVar17 & 0x7fff;
                  local_1248._0_4_ = uVar174;
                  local_1148 = lVar180;
                  uVar172 = uVar18 & 0x7fff;
                  local_1258._0_4_ = uVar172;
                  uVar158 = *(uint *)(lVar180 + 4 + lVar178);
                  uVar175 = (ulong)uVar158;
                  uVar177 = (ulong)(uVar158 * uVar172 + *(int *)(lVar180 + lVar178) + uVar174);
                  lVar21 = *(long *)&pGVar20[2].numPrimitives;
                  lVar179 = (long)itime.field_0.i[k] * 0x38;
                  lVar22 = *(long *)(lVar21 + lVar179);
                  lVar23 = *(long *)(lVar21 + 0x10 + lVar179);
                  pfVar12 = (float *)(lVar22 + lVar23 * uVar177);
                  lVar24 = *(long *)(lVar21 + 0x48 + lVar179);
                  pfVar13 = (float *)(lVar22 + (uVar177 + 1) * lVar23);
                  lVar170 = uVar177 + uVar175;
                  lVar173 = uVar177 + uVar175 + 1;
                  pfVar14 = (float *)(lVar22 + lVar170 * lVar23);
                  pfVar15 = (float *)(lVar22 + lVar173 * lVar23);
                  uVar161 = (ulong)(-1 < (short)uVar17);
                  lVar168 = uVar177 + uVar161 + 1;
                  pfVar1 = (float *)(lVar22 + lVar168 * lVar23);
                  lVar171 = uVar161 + lVar173;
                  uVar161 = 0;
                  if (-1 < (short)uVar18) {
                    uVar161 = uVar175;
                  }
                  pfVar2 = (float *)(lVar22 + lVar171 * lVar23);
                  pfVar3 = (float *)(lVar22 + (lVar170 + uVar161) * lVar23);
                  pfVar4 = (float *)(lVar22 + (lVar173 + uVar161) * lVar23);
                  pfVar5 = (float *)(lVar22 + lVar23 * (uVar161 + lVar171));
                  fVar343 = *pfVar5;
                  fVar379 = pfVar5[1];
                  lVar21 = *(long *)(lVar21 + 0x38 + lVar179);
                  pfVar5 = (float *)(lVar21 + lVar24 * uVar177);
                  pfVar6 = (float *)(lVar21 + lVar24 * (uVar177 + 1));
                  pfVar7 = (float *)(lVar21 + lVar24 * lVar170);
                  uVar176 = (uint)local_13a8;
                  pfVar8 = (float *)(lVar21 + lVar24 * lVar173);
                  pfVar9 = (float *)(lVar21 + lVar24 * lVar168);
                  pfVar10 = (float *)(lVar21 + lVar24 * lVar171);
                  fVar368 = *(float *)((long)&stack[-1].ptr.ptr + k * 4);
                  pfVar11 = (float *)(lVar21 + lVar24 * (lVar170 + uVar161));
                  fVar196 = (*pfVar6 - *pfVar13) * fVar368 + *pfVar13;
                  local_11c8._0_4_ = (pfVar6[1] - pfVar13[1]) * fVar368 + pfVar13[1];
                  fVar386 = (pfVar6[2] - pfVar13[2]) * fVar368 + pfVar13[2];
                  pfVar13 = (float *)(lVar21 + lVar24 * (lVar173 + uVar161));
                  local_11d8._0_4_ = (*pfVar7 - *pfVar14) * fVar368 + *pfVar14;
                  fVar346 = (pfVar7[1] - pfVar14[1]) * fVar368 + pfVar14[1];
                  fVar257 = (pfVar7[2] - pfVar14[2]) * fVar368 + pfVar14[2];
                  pfVar14 = (float *)(lVar21 + (uVar161 + lVar171) * lVar24);
                  fVar295 = pfVar14[1];
                  fVar304 = (*pfVar8 - *pfVar15) * fVar368 + *pfVar15;
                  fVar326 = (pfVar8[1] - pfVar15[1]) * fVar368 + pfVar15[1];
                  fVar334 = (pfVar8[2] - pfVar15[2]) * fVar368 + pfVar15[2];
                  local_11c8._4_4_ = (pfVar9[1] - pfVar1[1]) * fVar368 + pfVar1[1];
                  fVar361 = (pfVar9[2] - pfVar1[2]) * fVar368 + pfVar1[2];
                  fVar327 = (*pfVar10 - *pfVar2) * fVar368 + *pfVar2;
                  fVar336 = (pfVar10[1] - pfVar2[1]) * fVar368 + pfVar2[1];
                  fVar340 = (pfVar10[2] - pfVar2[2]) * fVar368 + pfVar2[2];
                  fVar325 = (pfVar11[1] - pfVar3[1]) * fVar368 + pfVar3[1];
                  fVar335 = (pfVar11[2] - pfVar3[2]) * fVar368 + pfVar3[2];
                  fVar339 = (*pfVar13 - *pfVar4) * fVar368 + *pfVar4;
                  fVar338 = (pfVar13[1] - pfVar4[1]) * fVar368 + pfVar4[1];
                  fVar342 = (pfVar13[2] - pfVar4[2]) * fVar368 + pfVar4[2];
                  valid.field_0.v[1] = fVar339;
                  valid.field_0.v[0] = (*pfVar14 - fVar343) * fVar368 + fVar343;
                  local_11d8._4_4_ = fVar304;
                  fVar343 = *(float *)(ray + k * 4);
                  fVar195 = *(float *)(ray + k * 4 + 0x10);
                  fVar355 = ((*pfVar5 - *pfVar12) * fVar368 + *pfVar12) - fVar343;
                  fVar356 = fVar196 - fVar343;
                  fVar359 = fVar304 - fVar343;
                  fVar360 = (float)local_11d8._0_4_ - fVar343;
                  local_11f8 = ((pfVar5[1] - pfVar12[1]) * fVar368 + pfVar12[1]) - fVar195;
                  fStack_11f4 = (float)local_11c8._0_4_ - fVar195;
                  fStack_11f0 = fVar326 - fVar195;
                  fStack_11ec = fVar346 - fVar195;
                  local_11b8 = CONCAT44((*pfVar9 - *pfVar1) * fVar368 + *pfVar1,fVar196);
                  fVar350 = fVar327 - fVar343;
                  fVar351 = fVar304 - fVar343;
                  _fStack_11d0 = auVar235._8_8_;
                  fVar381 = (float)local_11d8._0_4_ - fVar343;
                  fVar385 = fVar304 - fVar343;
                  fVar339 = fVar339 - fVar343;
                  fVar343 = ((*pfVar11 - *pfVar3) * fVar368 + *pfVar3) - fVar343;
                  fStack_11c0 = fVar336;
                  fStack_11bc = fVar326;
                  fVar352 = (float)local_11c8._0_4_ - fVar195;
                  fVar357 = (float)local_11c8._4_4_ - fVar195;
                  fVar362 = fVar336 - fVar195;
                  fVar366 = fVar326 - fVar195;
                  fVar328 = fVar346 - fVar195;
                  fVar337 = fVar326 - fVar195;
                  fVar341 = fVar338 - fVar195;
                  fVar195 = fVar325 - fVar195;
                  fVar196 = *(float *)(ray + k * 4 + 0x20);
                  local_fc8 = ((pfVar5[2] - pfVar12[2]) * fVar368 + pfVar12[2]) - fVar196;
                  fStack_fc4 = fVar386 - fVar196;
                  fStack_fc0 = fVar334 - fVar196;
                  fStack_fbc = fVar257 - fVar196;
                  local_11a8 = CONCAT44(fVar361,fVar386);
                  local_1198 = CONCAT44(fVar334,fVar340);
                  fVar386 = fVar386 - fVar196;
                  fVar361 = fVar361 - fVar196;
                  fVar387 = fVar340 - fVar196;
                  fVar388 = fVar334 - fVar196;
                  fVar389 = fVar257 - fVar196;
                  fVar390 = fVar334 - fVar196;
                  fVar391 = fVar342 - fVar196;
                  fVar196 = fVar335 - fVar196;
                  fVar364 = fVar381 - fVar355;
                  fVar370 = fVar385 - fVar356;
                  fVar373 = fVar339 - fVar359;
                  fVar376 = fVar343 - fVar360;
                  local_fd8 = fVar328 - local_11f8;
                  fStack_fd4 = fVar337 - fStack_11f4;
                  fStack_fd0 = fVar341 - fStack_11f0;
                  fStack_fcc = fVar195 - fStack_11ec;
                  local_fb8 = fVar389 - local_fc8;
                  fStack_fb4 = fVar390 - fStack_fc4;
                  fStack_fb0 = fVar391 - fStack_fc0;
                  fStack_fac = fVar196 - fStack_fbc;
                  local_1208 = fVar364;
                  fStack_1204 = fVar370;
                  fStack_1200 = fVar373;
                  fStack_11fc = fVar376;
                  fVar365 = *(float *)(ray + k * 4 + 0x50);
                  fVar275 = *(float *)(ray + k * 4 + 0x60);
                  fVar294 = *(float *)(ray + k * 4 + 0x40);
                  fVar319 = (local_fd8 * (fVar389 + local_fc8) - (fVar328 + local_11f8) * local_fb8)
                            * fVar294 +
                            ((fVar381 + fVar355) * local_fb8 - (fVar389 + local_fc8) * fVar364) *
                            fVar365 + (fVar364 * (fVar328 + local_11f8) -
                                      (fVar381 + fVar355) * local_fd8) * fVar275;
                  fVar324 = (fStack_fd4 * (fVar390 + fStack_fc4) -
                            (fVar337 + fStack_11f4) * fStack_fb4) * fVar294 +
                            ((fVar385 + fVar356) * fStack_fb4 - (fVar390 + fStack_fc4) * fVar370) *
                            fVar365 + (fVar370 * (fVar337 + fStack_11f4) -
                                      (fVar385 + fVar356) * fStack_fd4) * fVar275;
                  local_ff8._0_8_ = CONCAT44(fVar324,fVar319);
                  local_ff8._8_4_ =
                       (fStack_fd0 * (fVar391 + fStack_fc0) - (fVar341 + fStack_11f0) * fStack_fb0)
                       * fVar294 +
                       ((fVar339 + fVar359) * fStack_fb0 - (fVar391 + fStack_fc0) * fVar373) *
                       fVar365 + (fVar373 * (fVar341 + fStack_11f0) -
                                 (fVar339 + fVar359) * fStack_fd0) * fVar275;
                  local_ff8._12_4_ =
                       (fStack_fcc * (fVar196 + fStack_fbc) - (fVar195 + fStack_11ec) * fStack_fac)
                       * fVar294 +
                       ((fVar343 + fVar360) * fStack_fac - (fVar196 + fStack_fbc) * fVar376) *
                       fVar365 + (fVar376 * (fVar195 + fStack_11ec) -
                                 (fVar343 + fVar360) * fStack_fcc) * fVar275;
                  fVar369 = fVar355 - fVar342;
                  fVar372 = fVar356 - fVar335;
                  fVar375 = fVar359 - fVar350;
                  fVar378 = fVar360 - fVar351;
                  fVar305 = local_11f8 - fVar352;
                  fVar316 = fStack_11f4 - fVar357;
                  fVar317 = fStack_11f0 - fVar362;
                  fVar318 = fStack_11ec - fVar366;
                  local_fe8 = local_fc8 - fVar386;
                  fStack_fe4 = fStack_fc4 - fVar361;
                  fStack_fe0 = fStack_fc0 - fVar387;
                  fStack_fdc = fStack_fbc - fVar388;
                  local_1008._0_4_ =
                       (fVar305 * (local_fc8 + fVar386) - (local_11f8 + fVar352) * local_fe8) *
                       fVar294 + ((fVar355 + fVar342) * local_fe8 - (local_fc8 + fVar386) * fVar369)
                                 * fVar365 +
                                 (fVar369 * (local_11f8 + fVar352) - (fVar355 + fVar342) * fVar305)
                                 * fVar275;
                  local_1008._4_4_ =
                       (fVar316 * (fStack_fc4 + fVar361) - (fStack_11f4 + fVar357) * fStack_fe4) *
                       fVar294 + ((fVar356 + fVar335) * fStack_fe4 -
                                 (fStack_fc4 + fVar361) * fVar372) * fVar365 +
                                 (fVar372 * (fStack_11f4 + fVar357) - (fVar356 + fVar335) * fVar316)
                                 * fVar275;
                  local_1008._8_4_ =
                       (fVar317 * (fStack_fc0 + fVar387) - (fStack_11f0 + fVar362) * fStack_fe0) *
                       fVar294 + ((fVar359 + fVar350) * fStack_fe0 -
                                 (fStack_fc0 + fVar387) * fVar375) * fVar365 +
                                 (fVar375 * (fStack_11f0 + fVar362) - (fVar359 + fVar350) * fVar317)
                                 * fVar275;
                  local_1008._12_4_ =
                       (fVar318 * (fStack_fbc + fVar388) - (fStack_11ec + fVar366) * fStack_fdc) *
                       fVar294 + ((fVar360 + fVar351) * fStack_fdc -
                                 (fStack_fbc + fVar388) * fVar378) * fVar365 +
                                 (fVar378 * (fStack_11ec + fVar366) - (fVar360 + fVar351) * fVar318)
                                 * fVar275;
                  fVar344 = fVar342 - fVar381;
                  fVar347 = fVar335 - fVar385;
                  fVar348 = fVar350 - fVar339;
                  fVar349 = fVar351 - fVar343;
                  fVar353 = fVar352 - fVar328;
                  fVar358 = fVar357 - fVar337;
                  fVar363 = fVar362 - fVar341;
                  fVar367 = fVar366 - fVar195;
                  fVar371 = fVar386 - fVar389;
                  fVar374 = fVar361 - fVar390;
                  fVar377 = fVar387 - fVar391;
                  fVar380 = fVar388 - fVar196;
                  auVar286._0_4_ =
                       (fVar353 * (fVar389 + fVar386) - (fVar328 + fVar352) * fVar371) * fVar294 +
                       ((fVar381 + fVar342) * fVar371 - (fVar389 + fVar386) * fVar344) * fVar365 +
                       (fVar344 * (fVar328 + fVar352) - (fVar381 + fVar342) * fVar353) * fVar275;
                  auVar286._4_4_ =
                       (fVar358 * (fVar390 + fVar361) - (fVar337 + fVar357) * fVar374) * fVar294 +
                       ((fVar385 + fVar335) * fVar374 - (fVar390 + fVar361) * fVar347) * fVar365 +
                       (fVar347 * (fVar337 + fVar357) - (fVar385 + fVar335) * fVar358) * fVar275;
                  auVar286._8_4_ =
                       (fVar363 * (fVar391 + fVar387) - (fVar341 + fVar362) * fVar377) * fVar294 +
                       ((fVar339 + fVar350) * fVar377 - (fVar391 + fVar387) * fVar348) * fVar365 +
                       (fVar348 * (fVar341 + fVar362) - (fVar339 + fVar350) * fVar363) * fVar275;
                  auVar286._12_4_ =
                       (fVar367 * (fVar196 + fVar388) - (fVar195 + fVar366) * fVar380) * fVar294 +
                       ((fVar343 + fVar351) * fVar380 - (fVar196 + fVar388) * fVar349) * fVar365 +
                       (fVar349 * (fVar195 + fVar366) - (fVar343 + fVar351) * fVar367) * fVar275;
                  fVar343 = fVar319 + local_1008._0_4_ + auVar286._0_4_;
                  fVar195 = fVar324 + local_1008._4_4_ + auVar286._4_4_;
                  fVar196 = local_ff8._8_4_ + local_1008._8_4_ + auVar286._8_4_;
                  fVar335 = local_ff8._12_4_ + local_1008._12_4_ + auVar286._12_4_;
                  auVar330._8_4_ = local_ff8._8_4_;
                  auVar330._0_8_ = local_ff8._0_8_;
                  auVar330._12_4_ = local_ff8._12_4_;
                  auVar235 = minps(auVar330,local_1008);
                  auVar235 = minps(auVar235,auVar286);
                  auVar393._8_4_ = local_ff8._8_4_;
                  auVar393._0_8_ = local_ff8._0_8_;
                  auVar393._12_4_ = local_ff8._12_4_;
                  auVar297 = maxps(auVar393,local_1008);
                  auVar297 = maxps(auVar297,auVar286);
                  local_1018 = ABS(fVar343);
                  fStack_1014 = ABS(fVar195);
                  fStack_1010 = ABS(fVar196);
                  fStack_100c = ABS(fVar335);
                  auVar394._4_4_ = -(uint)(auVar297._4_4_ <= fStack_1014 * 1.1920929e-07);
                  auVar394._0_4_ = -(uint)(auVar297._0_4_ <= local_1018 * 1.1920929e-07);
                  auVar394._8_4_ = -(uint)(auVar297._8_4_ <= fStack_1010 * 1.1920929e-07);
                  auVar394._12_4_ = -(uint)(auVar297._12_4_ <= fStack_100c * 1.1920929e-07);
                  auVar331._4_4_ = -(uint)(-(fStack_1014 * 1.1920929e-07) <= auVar235._4_4_);
                  auVar331._0_4_ = -(uint)(-(local_1018 * 1.1920929e-07) <= auVar235._0_4_);
                  auVar331._8_4_ = -(uint)(-(fStack_1010 * 1.1920929e-07) <= auVar235._8_4_);
                  auVar331._12_4_ = -(uint)(-(fStack_100c * 1.1920929e-07) <= auVar235._12_4_);
                  auVar394 = auVar394 | auVar331;
                  iVar159 = movmskps((int)lVar21,auVar394);
                  local_1248 = ZEXT416(uVar174);
                  local_1258 = ZEXT416(uVar172);
                  uVar158 = (uint)local_13a0;
                  local_10b8 = ZEXT416(uVar158);
                  local_10c8 = ZEXT416(uVar176);
                  uVar157 = SUB84(ray,0);
                  uVar161 = local_13a0;
                  local_13b0 = lVar178;
                  if (iVar159 != 0) {
                    local_1208 = fVar343;
                    fStack_1204 = fVar195;
                    fStack_1200 = fVar196;
                    fStack_11fc = fVar335;
                    uVar181 = -(uint)(ABS(fVar353 * local_fe8) <= ABS(fVar305 * local_fb8));
                    uVar184 = -(uint)(ABS(fVar358 * fStack_fe4) <= ABS(fVar316 * fStack_fb4));
                    uVar187 = -(uint)(ABS(fVar363 * fStack_fe0) <= ABS(fVar317 * fStack_fb0));
                    uVar190 = -(uint)(ABS(fVar367 * fStack_fdc) <= ABS(fVar318 * fStack_fac));
                    uVar182 = -(uint)(ABS(fVar369 * fVar371) <= ABS(fVar364 * local_fe8));
                    uVar185 = -(uint)(ABS(fVar372 * fVar374) <= ABS(fVar370 * fStack_fe4));
                    uVar188 = -(uint)(ABS(fVar375 * fVar377) <= ABS(fVar373 * fStack_fe0));
                    uVar191 = -(uint)(ABS(fVar378 * fVar380) <= ABS(fVar376 * fStack_fdc));
                    uVar183 = -(uint)(ABS(fVar344 * fVar305) <= ABS(fVar369 * local_fd8));
                    uVar186 = -(uint)(ABS(fVar347 * fVar316) <= ABS(fVar372 * fStack_fd4));
                    uVar189 = -(uint)(ABS(fVar348 * fVar317) <= ABS(fVar375 * fStack_fd0));
                    uVar192 = -(uint)(ABS(fVar349 * fVar318) <= ABS(fVar378 * fStack_fcc));
                    auVar310._0_4_ = (uint)(fVar305 * fVar371 - fVar353 * local_fe8) & uVar181;
                    auVar310._4_4_ = (uint)(fVar316 * fVar374 - fVar358 * fStack_fe4) & uVar184;
                    auVar310._8_4_ = (uint)(fVar317 * fVar377 - fVar363 * fStack_fe0) & uVar187;
                    auVar310._12_4_ = (uint)(fVar318 * fVar380 - fVar367 * fStack_fdc) & uVar190;
                    auVar392._0_4_ = ~uVar181 & (uint)(local_fd8 * local_fe8 - fVar305 * local_fb8);
                    auVar392._4_4_ =
                         ~uVar184 & (uint)(fStack_fd4 * fStack_fe4 - fVar316 * fStack_fb4);
                    auVar392._8_4_ =
                         ~uVar187 & (uint)(fStack_fd0 * fStack_fe0 - fVar317 * fStack_fb0);
                    auVar392._12_4_ =
                         ~uVar190 & (uint)(fStack_fcc * fStack_fdc - fVar318 * fStack_fac);
                    auVar111._4_4_ = fVar195;
                    auVar111._0_4_ = fVar343;
                    auVar111._8_4_ = fVar196;
                    auVar111._12_4_ = fVar335;
                    auVar392 = auVar392 | auVar310;
                    fVar328 = (float)(~uVar182 & (uint)(local_fb8 * fVar369 - fVar364 * local_fe8) |
                                     (uint)(fVar344 * local_fe8 - fVar369 * fVar371) & uVar182);
                    fVar337 = (float)(~uVar185 & (uint)(fStack_fb4 * fVar372 - fVar370 * fStack_fe4)
                                     | (uint)(fVar347 * fStack_fe4 - fVar372 * fVar374) & uVar185);
                    fVar341 = (float)(~uVar188 & (uint)(fStack_fb0 * fVar375 - fVar373 * fStack_fe0)
                                     | (uint)(fVar348 * fStack_fe0 - fVar375 * fVar377) & uVar188);
                    fVar352 = (float)(~uVar191 & (uint)(fStack_fac * fVar378 - fVar376 * fStack_fdc)
                                     | (uint)(fVar349 * fStack_fdc - fVar378 * fVar380) & uVar191);
                    fVar364 = (float)(~uVar183 & (uint)(fVar364 * fVar305 - fVar369 * local_fd8) |
                                     (uint)(fVar369 * fVar353 - fVar344 * fVar305) & uVar183);
                    fVar369 = (float)(~uVar186 & (uint)(fVar370 * fVar316 - fVar372 * fStack_fd4) |
                                     (uint)(fVar372 * fVar358 - fVar347 * fVar316) & uVar186);
                    fVar370 = (float)(~uVar189 & (uint)(fVar373 * fVar317 - fVar375 * fStack_fd0) |
                                     (uint)(fVar375 * fVar363 - fVar348 * fVar317) & uVar189);
                    fVar372 = (float)(~uVar192 & (uint)(fVar376 * fVar318 - fVar378 * fStack_fcc) |
                                     (uint)(fVar378 * fVar367 - fVar349 * fVar318) & uVar192);
                    fVar339 = fVar294 * auVar392._0_4_ + fVar365 * fVar328 + fVar275 * fVar364;
                    fVar342 = fVar294 * auVar392._4_4_ + fVar365 * fVar337 + fVar275 * fVar369;
                    fVar350 = fVar294 * auVar392._8_4_ + fVar365 * fVar341 + fVar275 * fVar370;
                    fVar365 = fVar294 * auVar392._12_4_ + fVar365 * fVar352 + fVar275 * fVar372;
                    auVar321._0_4_ = fVar339 + fVar339;
                    auVar321._4_4_ = fVar342 + fVar342;
                    auVar321._8_4_ = fVar350 + fVar350;
                    auVar321._12_4_ = fVar365 + fVar365;
                    auVar241._0_4_ = local_fc8 * fVar364;
                    auVar241._4_4_ = fStack_fc4 * fVar369;
                    auVar241._8_4_ = fStack_fc0 * fVar370;
                    auVar241._12_4_ = fStack_fbc * fVar372;
                    fVar275 = fVar355 * auVar392._0_4_ + local_11f8 * fVar328 + auVar241._0_4_;
                    fVar350 = fVar356 * auVar392._4_4_ + fStack_11f4 * fVar337 + auVar241._4_4_;
                    fVar351 = fVar359 * auVar392._8_4_ + fStack_11f0 * fVar341 + auVar241._8_4_;
                    fVar355 = fVar360 * auVar392._12_4_ + fStack_11ec * fVar352 + auVar241._12_4_;
                    auVar235 = rcpps(auVar241,auVar321);
                    fVar365 = auVar235._0_4_;
                    fVar294 = auVar235._4_4_;
                    fVar339 = auVar235._8_4_;
                    fVar342 = auVar235._12_4_;
                    fVar275 = ((1.0 - auVar321._0_4_ * fVar365) * fVar365 + fVar365) *
                              (fVar275 + fVar275);
                    fVar294 = ((1.0 - auVar321._4_4_ * fVar294) * fVar294 + fVar294) *
                              (fVar350 + fVar350);
                    fVar339 = ((1.0 - auVar321._8_4_ * fVar339) * fVar339 + fVar339) *
                              (fVar351 + fVar351);
                    fVar342 = ((1.0 - auVar321._12_4_ * fVar342) * fVar342 + fVar342) *
                              (fVar355 + fVar355);
                    fVar365 = *(float *)(ray + k * 4 + 0x30);
                    auVar242._0_4_ =
                         -(uint)(fVar275 <= (float)local_11e8._0_4_ && fVar365 <= fVar275) &
                         auVar394._0_4_;
                    auVar242._4_4_ =
                         -(uint)(fVar294 <= (float)local_11e8._0_4_ && fVar365 <= fVar294) &
                         auVar394._4_4_;
                    auVar242._8_4_ =
                         -(uint)(fVar339 <= (float)local_11e8._0_4_ && fVar365 <= fVar339) &
                         auVar394._8_4_;
                    auVar242._12_4_ =
                         -(uint)(fVar342 <= (float)local_11e8._0_4_ && fVar365 <= fVar342) &
                         auVar394._12_4_;
                    iVar159 = movmskps(uVar157,auVar242);
                    if (iVar159 != 0) {
                      aVar243._0_4_ = auVar242._0_4_ & -(uint)(auVar321._0_4_ != 0.0);
                      aVar243._4_4_ = auVar242._4_4_ & -(uint)(auVar321._4_4_ != 0.0);
                      aVar243._8_4_ = auVar242._8_4_ & -(uint)(auVar321._8_4_ != 0.0);
                      aVar243._12_4_ = auVar242._12_4_ & -(uint)(auVar321._12_4_ != 0.0);
                      iVar159 = movmskps(iVar159,(undefined1  [16])aVar243);
                      if (iVar159 != 0) {
                        local_12a8._4_4_ = fVar294;
                        local_12a8._0_4_ = fVar275;
                        fStack_12a0 = fVar339;
                        fStack_129c = fVar342;
                        local_1298 = auVar392;
                        local_1288._4_4_ = fVar337;
                        local_1288._0_4_ = fVar328;
                        fStack_1280 = fVar341;
                        fStack_127c = fVar352;
                        local_1278[0] = fVar364;
                        local_1278[1] = fVar369;
                        local_1278[2] = fVar370;
                        local_1278[3] = fVar372;
                        auVar244._4_12_ = aVar243._4_12_;
                        auVar244._0_4_ = (float)(int)(*(ushort *)(lVar180 + 8 + lVar178) - 1);
                        auVar300._4_4_ = aVar243._4_4_;
                        auVar300._0_4_ = auVar244._0_4_;
                        auVar300._8_4_ = aVar243._8_4_;
                        auVar300._12_4_ = aVar243._12_4_;
                        auVar235 = rcpss(auVar300,auVar244);
                        auVar311._4_12_ = auVar310._4_12_;
                        auVar311._0_4_ = (float)(int)(*(ushort *)(lVar180 + 10 + lVar178) - 1);
                        fVar365 = (2.0 - auVar244._0_4_ * auVar235._0_4_) * auVar235._0_4_;
                        auVar301._4_4_ = auVar310._4_4_;
                        auVar301._0_4_ = auVar311._0_4_;
                        auVar301._8_4_ = auVar310._8_4_;
                        auVar301._12_4_ = auVar310._12_4_;
                        auVar235 = rcpss(auVar301,auVar311);
                        fVar275 = (2.0 - auVar311._0_4_ * auVar235._0_4_) * auVar235._0_4_;
                        auVar287._0_4_ = (float)uVar174 * fVar343 + fVar319;
                        auVar287._4_4_ = (float)(uVar174 + 1) * fVar195 + fVar324;
                        auVar287._8_4_ = (float)(uVar174 + 1) * fVar196 + local_ff8._8_4_;
                        auVar287._12_4_ = (float)uVar174 * fVar335 + local_ff8._12_4_;
                        tNear.field_0.v[1] = fVar365 * auVar287._4_4_;
                        tNear.field_0.v[0] = fVar365 * auVar287._0_4_;
                        tNear.field_0.v[2] = fVar365 * auVar287._8_4_;
                        tNear.field_0.v[3] = fVar365 * auVar287._12_4_;
                        pGVar20 = (local_1150->geometries).items[local_13a0].ptr;
                        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar235 = rcpps(auVar287,auVar111);
                          fVar294 = auVar235._0_4_;
                          fVar339 = auVar235._4_4_;
                          fVar342 = auVar235._8_4_;
                          fVar350 = auVar235._12_4_;
                          fVar294 = (float)(-(uint)(1e-18 <= local_1018) &
                                           (uint)(((float)DAT_01feca10 - fVar343 * fVar294) *
                                                  fVar294 + fVar294));
                          fVar339 = (float)(-(uint)(1e-18 <= fStack_1014) &
                                           (uint)((DAT_01feca10._4_4_ - fVar195 * fVar339) * fVar339
                                                 + fVar339));
                          fVar342 = (float)(-(uint)(1e-18 <= fStack_1010) &
                                           (uint)((DAT_01feca10._8_4_ - fVar196 * fVar342) * fVar342
                                                 + fVar342));
                          fVar350 = (float)(-(uint)(1e-18 <= fStack_100c) &
                                           (uint)((DAT_01feca10._12_4_ - fVar335 * fVar350) *
                                                  fVar350 + fVar350));
                          auVar207._0_4_ = fVar365 * auVar287._0_4_ * fVar294;
                          auVar207._4_4_ = fVar365 * auVar287._4_4_ * fVar339;
                          auVar207._8_4_ = fVar365 * auVar287._8_4_ * fVar342;
                          auVar207._12_4_ = fVar365 * auVar287._12_4_ * fVar350;
                          local_12c8 = minps(auVar207,_DAT_01feca10);
                          auVar245._0_4_ =
                               fVar275 * ((float)uVar172 * fVar343 + local_1008._0_4_) * fVar294;
                          auVar245._4_4_ =
                               fVar275 * ((float)uVar172 * fVar195 + local_1008._4_4_) * fVar339;
                          auVar245._8_4_ =
                               fVar275 * ((float)(uVar172 + 1) * fVar196 + local_1008._8_4_) *
                               fVar342;
                          auVar245._12_4_ =
                               fVar275 * ((float)(uVar172 + 1) * fVar335 + local_1008._12_4_) *
                               fVar350;
                          local_12b8 = minps(auVar245,_DAT_01feca10);
                          auVar297 = ~(undefined1  [16])aVar243 & _DAT_01feb9f0 |
                                     _local_12a8 & (undefined1  [16])aVar243;
                          auVar288._4_4_ = auVar297._0_4_;
                          auVar288._0_4_ = auVar297._4_4_;
                          auVar288._8_4_ = auVar297._12_4_;
                          auVar288._12_4_ = auVar297._8_4_;
                          auVar235 = minps(auVar288,auVar297);
                          auVar208._0_8_ = auVar235._8_8_;
                          auVar208._8_4_ = auVar235._0_4_;
                          auVar208._12_4_ = auVar235._4_4_;
                          auVar235 = minps(auVar208,auVar235);
                          auVar209._0_8_ =
                               CONCAT44(-(uint)(auVar235._4_4_ == auVar297._4_4_) & aVar243._4_4_,
                                        -(uint)(auVar235._0_4_ == auVar297._0_4_) & aVar243._0_4_);
                          auVar209._8_4_ = -(uint)(auVar235._8_4_ == auVar297._8_4_) & aVar243._8_4_
                          ;
                          auVar209._12_4_ =
                               -(uint)(auVar235._12_4_ == auVar297._12_4_) & aVar243._12_4_;
                          iVar159 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar209);
                          aVar262 = aVar243;
                          if (iVar159 != 0) {
                            aVar262.i[2] = auVar209._8_4_;
                            aVar262._0_8_ = auVar209._0_8_;
                            aVar262.i[3] = auVar209._12_4_;
                          }
                          uVar172 = movmskps(iVar159,(undefined1  [16])aVar262);
                          lVar170 = 0;
                          if (uVar172 != 0) {
                            for (; (uVar172 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
                            }
                          }
                          valid.field_0 = aVar243;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar165 = *(undefined4 *)(local_12c8 + lVar170 * 4);
                            uVar167 = *(undefined4 *)(local_12b8 + lVar170 * 4);
                            uVar16 = *(undefined4 *)(local_1298 + lVar170 * 4);
                            fVar195 = local_1278[lVar170 + -4];
                            fVar343 = local_1278[lVar170];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_12a8 + lVar170 * 4);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar16;
                            *(float *)(ray + k * 4 + 0xd0) = fVar195;
                            *(float *)(ray + k * 4 + 0xe0) = fVar343;
                            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar165;
                            *(undefined4 *)(ray + k * 4 + 0x100) = uVar167;
                            *(uint *)(ray + k * 4 + 0x110) = uVar176;
                            *(uint *)(ray + k * 4 + 0x120) = uVar158;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_1398 = *(undefined8 *)(mm_lookupmask_ps + lVar160);
                            uStack_1390 = *(undefined8 *)(mm_lookupmask_ps + lVar160 + 8);
                            uVar175 = local_13a8;
                            local_1388 = (float)uVar176;
                            fStack_1384 = (float)uVar176;
                            fStack_1380 = (float)uVar176;
                            fStack_137c = (float)uVar176;
                            do {
                              uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_1078 = *(undefined4 *)(local_12c8 + lVar170 * 4);
                              local_1068 = *(undefined4 *)(local_12b8 + lVar170 * 4);
                              *(undefined4 *)(ray + k * 4 + 0x80) =
                                   *(undefined4 *)(local_12a8 + lVar170 * 4);
                              args.context = context->user;
                              local_10a8 = *(undefined4 *)(local_1298 + lVar170 * 4);
                              local_1098._4_4_ = local_1278[lVar170 + -4];
                              local_1088._4_4_ = local_1278[lVar170];
                              uStack_10a4 = local_10a8;
                              uStack_10a0 = local_10a8;
                              uStack_109c = local_10a8;
                              local_1098._0_4_ = local_1098._4_4_;
                              fStack_1090 = (float)local_1098._4_4_;
                              fStack_108c = (float)local_1098._4_4_;
                              local_1088._0_4_ = local_1088._4_4_;
                              fStack_1080 = (float)local_1088._4_4_;
                              fStack_107c = (float)local_1088._4_4_;
                              uStack_1074 = local_1078;
                              uStack_1070 = local_1078;
                              uStack_106c = local_1078;
                              uStack_1064 = local_1068;
                              uStack_1060 = local_1068;
                              uStack_105c = local_1068;
                              local_1058 = CONCAT44(fStack_1384,local_1388);
                              uStack_1050 = CONCAT44(fStack_137c,fStack_1380);
                              local_1048 = CONCAT44(uVar158,uVar158);
                              uStack_1040 = CONCAT44(uVar158,uVar158);
                              local_1038 = (args.context)->instID[0];
                              uStack_1034 = local_1038;
                              uStack_1030 = local_1038;
                              uStack_102c = local_1038;
                              local_1028 = (args.context)->instPrimID[0];
                              uStack_1024 = local_1028;
                              uStack_1020 = local_1028;
                              uStack_101c = local_1028;
                              local_13c8 = local_1398;
                              uStack_13c0 = uStack_1390;
                              args.valid = (int *)&local_13c8;
                              pRVar169 = (RTCIntersectArguments *)pGVar20->userPtr;
                              args.hit = (RTCHitN *)&local_10a8;
                              args.N = 4;
                              p_Var164 = pGVar20->intersectionFilterN;
                              args.geometryUserPtr = pRVar169;
                              args.ray = (RTCRayN *)ray;
                              if (p_Var164 != (RTCFilterFunctionN)0x0) {
                                p_Var164 = (RTCFilterFunctionN)(*p_Var164)(&args);
                                uVar161 = local_13a0;
                                uVar175 = local_13a8;
                                lVar178 = local_13b0;
                              }
                              auVar214._0_4_ = -(uint)((int)local_13c8 == 0);
                              auVar214._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                              auVar214._8_4_ = -(uint)((int)uStack_13c0 == 0);
                              auVar214._12_4_ = -(uint)(uStack_13c0._4_4_ == 0);
                              uVar172 = movmskps((int)p_Var164,auVar214);
                              pRVar163 = (RTCRayN *)(ulong)(uVar172 ^ 0xf);
                              if ((uVar172 ^ 0xf) == 0) {
                                auVar214 = auVar214 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar169 = context->args;
                                p_Var164 = pRVar169->filter;
                                if ((p_Var164 != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar169->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                     != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                                  p_Var164 = (RTCFilterFunctionN)(*p_Var164)(&args);
                                  uVar161 = local_13a0;
                                  uVar175 = local_13a8;
                                  lVar178 = local_13b0;
                                }
                                auVar249._0_4_ = -(uint)((int)local_13c8 == 0);
                                auVar249._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                                auVar249._8_4_ = -(uint)((int)uStack_13c0 == 0);
                                auVar249._12_4_ = -(uint)(uStack_13c0._4_4_ == 0);
                                auVar214 = auVar249 ^ _DAT_01febe20;
                                uVar172 = movmskps((int)p_Var164,auVar249);
                                pRVar163 = (RTCRayN *)(ulong)(uVar172 ^ 0xf);
                                if ((uVar172 ^ 0xf) != 0) {
                                  uVar172 = *(uint *)(args.hit + 4);
                                  uVar174 = *(uint *)(args.hit + 8);
                                  uVar176 = *(uint *)(args.hit + 0xc);
                                  *(uint *)(args.ray + 0xc0) =
                                       ~auVar249._0_4_ & *(uint *)args.hit |
                                       *(uint *)(args.ray + 0xc0) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0xc4) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0xc4) & auVar249._4_4_;
                                  *(uint *)(args.ray + 200) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 200) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0xcc) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0xcc) & auVar249._12_4_;
                                  uVar172 = *(uint *)(args.hit + 0x14);
                                  uVar174 = *(uint *)(args.hit + 0x18);
                                  uVar176 = *(uint *)(args.hit + 0x1c);
                                  *(uint *)(args.ray + 0xd0) =
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x10) |
                                       *(uint *)(args.ray + 0xd0) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0xd4) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0xd4) & auVar249._4_4_;
                                  *(uint *)(args.ray + 0xd8) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 0xd8) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0xdc) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0xdc) & auVar249._12_4_;
                                  uVar172 = *(uint *)(args.hit + 0x24);
                                  uVar174 = *(uint *)(args.hit + 0x28);
                                  uVar176 = *(uint *)(args.hit + 0x2c);
                                  *(uint *)(args.ray + 0xe0) =
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x20) |
                                       *(uint *)(args.ray + 0xe0) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0xe4) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0xe4) & auVar249._4_4_;
                                  *(uint *)(args.ray + 0xe8) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 0xe8) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0xec) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0xec) & auVar249._12_4_;
                                  auVar314._0_4_ = *(uint *)(args.ray + 0xf0) & auVar249._0_4_;
                                  auVar314._4_4_ = *(uint *)(args.ray + 0xf4) & auVar249._4_4_;
                                  auVar314._8_4_ = *(uint *)(args.ray + 0xf8) & auVar249._8_4_;
                                  auVar314._12_4_ = *(uint *)(args.ray + 0xfc) & auVar249._12_4_;
                                  auVar268._0_4_ = ~auVar249._0_4_ & *(uint *)(args.hit + 0x30);
                                  auVar268._4_4_ = ~auVar249._4_4_ & *(uint *)(args.hit + 0x34);
                                  auVar268._8_4_ = ~auVar249._8_4_ & *(uint *)(args.hit + 0x38);
                                  auVar268._12_4_ = ~auVar249._12_4_ & *(uint *)(args.hit + 0x3c);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar268 | auVar314;
                                  uVar172 = *(uint *)(args.hit + 0x44);
                                  uVar174 = *(uint *)(args.hit + 0x48);
                                  uVar176 = *(uint *)(args.hit + 0x4c);
                                  *(uint *)(args.ray + 0x100) =
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x40) |
                                       *(uint *)(args.ray + 0x100) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0x104) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0x104) & auVar249._4_4_;
                                  *(uint *)(args.ray + 0x108) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 0x108) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0x10c) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0x10c) & auVar249._12_4_;
                                  uVar172 = *(uint *)(args.hit + 0x54);
                                  uVar174 = *(uint *)(args.hit + 0x58);
                                  uVar176 = *(uint *)(args.hit + 0x5c);
                                  *(uint *)(args.ray + 0x110) =
                                       *(uint *)(args.ray + 0x110) & auVar249._0_4_ |
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x50);
                                  *(uint *)(args.ray + 0x114) =
                                       *(uint *)(args.ray + 0x114) & auVar249._4_4_ |
                                       ~auVar249._4_4_ & uVar172;
                                  *(uint *)(args.ray + 0x118) =
                                       *(uint *)(args.ray + 0x118) & auVar249._8_4_ |
                                       ~auVar249._8_4_ & uVar174;
                                  *(uint *)(args.ray + 0x11c) =
                                       *(uint *)(args.ray + 0x11c) & auVar249._12_4_ |
                                       ~auVar249._12_4_ & uVar176;
                                  uVar172 = *(uint *)(args.hit + 100);
                                  uVar174 = *(uint *)(args.hit + 0x68);
                                  uVar176 = *(uint *)(args.hit + 0x6c);
                                  *(uint *)(args.ray + 0x120) =
                                       *(uint *)(args.ray + 0x120) & auVar249._0_4_ |
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x60);
                                  *(uint *)(args.ray + 0x124) =
                                       *(uint *)(args.ray + 0x124) & auVar249._4_4_ |
                                       ~auVar249._4_4_ & uVar172;
                                  *(uint *)(args.ray + 0x128) =
                                       *(uint *)(args.ray + 0x128) & auVar249._8_4_ |
                                       ~auVar249._8_4_ & uVar174;
                                  *(uint *)(args.ray + 300) =
                                       *(uint *)(args.ray + 300) & auVar249._12_4_ |
                                       ~auVar249._12_4_ & uVar176;
                                  uVar172 = *(uint *)(args.hit + 0x74);
                                  uVar174 = *(uint *)(args.hit + 0x78);
                                  uVar176 = *(uint *)(args.hit + 0x7c);
                                  *(uint *)(args.ray + 0x130) =
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x70) |
                                       *(uint *)(args.ray + 0x130) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0x134) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0x134) & auVar249._4_4_;
                                  *(uint *)(args.ray + 0x138) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 0x138) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0x13c) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0x13c) & auVar249._12_4_;
                                  uVar172 = *(uint *)(args.hit + 0x84);
                                  uVar174 = *(uint *)(args.hit + 0x88);
                                  uVar176 = *(uint *)(args.hit + 0x8c);
                                  *(uint *)(args.ray + 0x140) =
                                       ~auVar249._0_4_ & *(uint *)(args.hit + 0x80) |
                                       *(uint *)(args.ray + 0x140) & auVar249._0_4_;
                                  *(uint *)(args.ray + 0x144) =
                                       ~auVar249._4_4_ & uVar172 |
                                       *(uint *)(args.ray + 0x144) & auVar249._4_4_;
                                  *(uint *)(args.ray + 0x148) =
                                       ~auVar249._8_4_ & uVar174 |
                                       *(uint *)(args.ray + 0x148) & auVar249._8_4_;
                                  *(uint *)(args.ray + 0x14c) =
                                       ~auVar249._12_4_ & uVar176 |
                                       *(uint *)(args.ray + 0x14c) & auVar249._12_4_;
                                  pRVar163 = args.ray;
                                  pRVar169 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              uVar176 = (uint)uVar175;
                              auVar215._0_4_ = auVar214._0_4_ << 0x1f;
                              auVar215._4_4_ = auVar214._4_4_ << 0x1f;
                              auVar215._8_4_ = auVar214._8_4_ << 0x1f;
                              auVar215._12_4_ = auVar214._12_4_ << 0x1f;
                              iVar159 = movmskps((int)pRVar163,auVar215);
                              if (iVar159 == 0) {
                                *(undefined4 *)(ray + k * 4 + 0x80) = uVar165;
                              }
                              valid.field_0.v[lVar170] = 0.0;
                              fVar343 = *(float *)(ray + k * 4 + 0x80);
                              valid.field_0.i[0] =
                                   -(uint)((float)local_12a8._0_4_ <= fVar343) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)((float)local_12a8._4_4_ <= fVar343) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(fStack_12a0 <= fVar343) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(fStack_129c <= fVar343) & valid.field_0.i[3];
                              iVar159 = movmskps(uVar157,(undefined1  [16])valid.field_0);
                              if (iVar159 != 0) {
                                auVar250._0_4_ = local_12a8._0_4_ & valid.field_0.i[0];
                                auVar250._4_4_ = local_12a8._4_4_ & valid.field_0.i[1];
                                auVar250._8_4_ = (uint)fStack_12a0 & valid.field_0.i[2];
                                auVar250._12_4_ = (uint)fStack_129c & valid.field_0.i[3];
                                auVar269._0_8_ =
                                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                     0x7f8000007f800000;
                                auVar269._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                                auVar269._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                                auVar269 = auVar269 | auVar250;
                                auVar291._4_4_ = auVar269._0_4_;
                                auVar291._0_4_ = auVar269._4_4_;
                                auVar291._8_4_ = auVar269._12_4_;
                                auVar291._12_4_ = auVar269._8_4_;
                                auVar235 = minps(auVar291,auVar269);
                                auVar251._0_8_ = auVar235._8_8_;
                                auVar251._8_4_ = auVar235._0_4_;
                                auVar251._12_4_ = auVar235._4_4_;
                                auVar235 = minps(auVar251,auVar235);
                                auVar252._0_8_ =
                                     CONCAT44(-(uint)(auVar235._4_4_ == auVar269._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar235._0_4_ == auVar269._0_4_) &
                                              valid.field_0.i[0]);
                                auVar252._8_4_ =
                                     -(uint)(auVar235._8_4_ == auVar269._8_4_) & valid.field_0.i[2];
                                auVar252._12_4_ =
                                     -(uint)(auVar235._12_4_ == auVar269._12_4_) &
                                     valid.field_0.i[3];
                                iVar166 = movmskps((int)pRVar169,auVar252);
                                aVar216 = valid.field_0;
                                if (iVar166 != 0) {
                                  aVar216.i[2] = auVar252._8_4_;
                                  aVar216._0_8_ = auVar252._0_8_;
                                  aVar216.i[3] = auVar252._12_4_;
                                }
                                uVar165 = movmskps(iVar166,(undefined1  [16])aVar216);
                                uVar177 = CONCAT44((int)((ulong)pRVar169 >> 0x20),uVar165);
                                lVar170 = 0;
                                if (uVar177 != 0) {
                                  for (; (uVar177 >> lVar170 & 1) == 0; lVar170 = lVar170 + 1) {
                                  }
                                }
                              }
                            } while ((char)iVar159 != '\0');
                          }
                        }
                      }
                    }
                  }
                  fVar343 = *(float *)(ray + k * 4);
                  fVar195 = *(float *)(ray + k * 4 + 0x10);
                  fVar196 = *(float *)(ray + k * 4 + 0x20);
                  fVar365 = *(float *)(ray + k * 4 + 0x40);
                  fVar275 = *(float *)(ray + k * 4 + 0x50);
                  fVar304 = fVar304 - fVar343;
                  fVar327 = fVar327 - fVar343;
                  fStack_13e0 = fStack_13e0 - fVar343;
                  fStack_13dc = fStack_13dc - fVar343;
                  fVar359 = fVar326 - fVar195;
                  fVar336 = fVar336 - fVar195;
                  fVar360 = ((fVar295 - fVar379) * fVar368 + fVar379) - fVar195;
                  fVar364 = fVar338 - fVar195;
                  fVar316 = fVar334 - fVar196;
                  fVar340 = fVar340 - fVar196;
                  fVar319 = extraout_XMM0_Dc - fVar196;
                  fVar328 = extraout_XMM0_Dd - fVar196;
                  fVar357 = (float)local_11d8._0_4_ - fVar343;
                  fVar358 = (float)local_11d8._4_4_ - fVar343;
                  fVar361 = fStack_11d0 - fVar343;
                  fVar362 = fStack_11cc - fVar343;
                  fVar346 = fVar346 - fVar195;
                  fVar326 = fVar326 - fVar195;
                  fVar338 = fVar338 - fVar195;
                  fVar325 = fVar325 - fVar195;
                  fVar257 = fVar257 - fVar196;
                  fVar334 = fVar334 - fVar196;
                  fVar295 = 0.0 - fVar196;
                  fVar339 = 0.0 - fVar196;
                  fVar386 = (float)local_11b8 - fVar343;
                  fVar387 = local_11b8._4_4_ - fVar343;
                  fVar388 = fStack_11b0 - fVar343;
                  fVar343 = fStack_11ac - fVar343;
                  fVar367 = (float)local_11c8._0_4_ - fVar195;
                  fVar371 = (float)local_11c8._4_4_ - fVar195;
                  fVar374 = fStack_11c0 - fVar195;
                  fVar195 = fStack_11bc - fVar195;
                  fVar341 = (float)local_11a8 - fVar196;
                  fVar344 = local_11a8._4_4_ - fVar196;
                  fVar347 = fStack_11a0 - fVar196;
                  fVar196 = fStack_119c - fVar196;
                  local_1388 = fVar386 - fVar304;
                  fStack_1384 = fVar387 - fVar327;
                  fStack_1380 = fVar388 - fStack_13e0;
                  fStack_137c = fVar343 - fStack_13dc;
                  fVar348 = fVar367 - fVar359;
                  fVar352 = fVar371 - fVar336;
                  fStack_11a0 = fVar374 - fVar360;
                  fStack_119c = fVar195 - fVar364;
                  fVar369 = fVar341 - fVar316;
                  fVar372 = fVar344 - fVar340;
                  fVar375 = fVar347 - fVar319;
                  fVar378 = fVar196 - fVar328;
                  local_1398 = CONCAT44(fVar372,fVar369);
                  uStack_1390 = CONCAT44(fVar378,fVar375);
                  fVar368 = *(float *)(ray + k * 4 + 0x60);
                  local_11a8 = CONCAT44(fVar352,fVar348);
                  fVar350 = fVar304 - fVar357;
                  fVar351 = fVar327 - fVar358;
                  fVar355 = fStack_13e0 - fVar361;
                  fVar356 = fStack_13dc - fVar362;
                  fVar294 = fVar359 - fVar346;
                  fVar379 = fVar336 - fVar326;
                  fVar335 = fVar360 - fVar338;
                  fVar342 = fVar364 - fVar325;
                  fVar363 = (fVar348 * (fVar341 + fVar316) - (fVar367 + fVar359) * fVar369) *
                            fVar365 + ((fVar386 + fVar304) * fVar369 -
                                      (fVar341 + fVar316) * local_1388) * fVar275 +
                                      (local_1388 * (fVar367 + fVar359) -
                                      (fVar386 + fVar304) * fVar348) * fVar368;
                  fVar366 = (fVar352 * (fVar344 + fVar340) - (fVar371 + fVar336) * fVar372) *
                            fVar365 + ((fVar387 + fVar327) * fVar372 -
                                      (fVar344 + fVar340) * fStack_1384) * fVar275 +
                                      (fStack_1384 * (fVar371 + fVar336) -
                                      (fVar387 + fVar327) * fVar352) * fVar368;
                  local_11d8 = (undefined1  [8])CONCAT44(fVar366,fVar363);
                  fStack_11d0 = (fStack_11a0 * (fVar347 + fVar319) - (fVar374 + fVar360) * fVar375)
                                * fVar365 +
                                ((fVar388 + fStack_13e0) * fVar375 -
                                (fVar347 + fVar319) * fStack_1380) * fVar275 +
                                (fStack_1380 * (fVar374 + fVar360) -
                                (fVar388 + fStack_13e0) * fStack_11a0) * fVar368;
                  fStack_11cc = (fStack_119c * (fVar196 + fVar328) - (fVar195 + fVar364) * fVar378)
                                * fVar365 +
                                ((fVar343 + fStack_13dc) * fVar378 -
                                (fVar196 + fVar328) * fStack_137c) * fVar275 +
                                (fStack_137c * (fVar195 + fVar364) -
                                (fVar343 + fStack_13dc) * fStack_119c) * fVar368;
                  fVar349 = fVar316 - fVar257;
                  fVar353 = fVar340 - fVar334;
                  fStack_11b0 = fVar319 - fVar295;
                  fStack_11ac = fVar328 - fVar339;
                  local_11b8 = CONCAT44(fVar353,fVar349);
                  local_11e8._0_4_ =
                       (fVar294 * (fVar316 + fVar257) - (fVar359 + fVar346) * fVar349) * fVar365 +
                       ((fVar304 + fVar357) * fVar349 - (fVar316 + fVar257) * fVar350) * fVar275 +
                       (fVar350 * (fVar359 + fVar346) - (fVar304 + fVar357) * fVar294) * fVar368;
                  local_11e8._4_4_ =
                       (fVar379 * (fVar340 + fVar334) - (fVar336 + fVar326) * fVar353) * fVar365 +
                       ((fVar327 + fVar358) * fVar353 - (fVar340 + fVar334) * fVar351) * fVar275 +
                       (fVar351 * (fVar336 + fVar326) - (fVar327 + fVar358) * fVar379) * fVar368;
                  local_11e8._8_4_ =
                       (fVar335 * (fVar319 + fVar295) - (fVar360 + fVar338) * fStack_11b0) * fVar365
                       + ((fStack_13e0 + fVar361) * fStack_11b0 - (fVar319 + fVar295) * fVar355) *
                         fVar275 + (fVar355 * (fVar360 + fVar338) -
                                   (fStack_13e0 + fVar361) * fVar335) * fVar368;
                  local_11e8._12_4_ =
                       (fVar342 * (fVar328 + fVar339) - (fVar364 + fVar325) * fStack_11ac) * fVar365
                       + ((fStack_13dc + fVar362) * fStack_11ac - (fVar328 + fVar339) * fVar356) *
                         fVar275 + (fVar356 * (fVar364 + fVar325) -
                                   (fStack_13dc + fVar362) * fVar342) * fVar368;
                  fVar370 = fVar357 - fVar386;
                  fVar373 = fVar358 - fVar387;
                  fVar376 = fVar361 - fVar388;
                  fVar305 = fVar362 - fVar343;
                  fVar377 = fVar346 - fVar367;
                  fVar380 = fVar326 - fVar371;
                  fVar381 = fVar338 - fVar374;
                  fVar385 = fVar325 - fVar195;
                  fVar317 = fVar257 - fVar341;
                  fVar318 = fVar334 - fVar344;
                  fVar324 = fVar295 - fVar347;
                  fVar337 = fVar339 - fVar196;
                  auVar263._0_4_ =
                       (fVar377 * (fVar341 + fVar257) - (fVar367 + fVar346) * fVar317) * fVar365 +
                       ((fVar386 + fVar357) * fVar317 - (fVar341 + fVar257) * fVar370) * fVar275 +
                       (fVar370 * (fVar367 + fVar346) - (fVar386 + fVar357) * fVar377) * fVar368;
                  auVar263._4_4_ =
                       (fVar380 * (fVar344 + fVar334) - (fVar371 + fVar326) * fVar318) * fVar365 +
                       ((fVar387 + fVar358) * fVar318 - (fVar344 + fVar334) * fVar373) * fVar275 +
                       (fVar373 * (fVar371 + fVar326) - (fVar387 + fVar358) * fVar380) * fVar368;
                  auVar263._8_4_ =
                       (fVar381 * (fVar347 + fVar295) - (fVar374 + fVar338) * fVar324) * fVar365 +
                       ((fVar388 + fVar361) * fVar324 - (fVar347 + fVar295) * fVar376) * fVar275 +
                       (fVar376 * (fVar374 + fVar338) - (fVar388 + fVar361) * fVar381) * fVar368;
                  auVar263._12_4_ =
                       (fVar385 * (fVar196 + fVar339) - (fVar195 + fVar325) * fVar337) * fVar365 +
                       ((fVar343 + fVar362) * fVar337 - (fVar196 + fVar339) * fVar305) * fVar275 +
                       (fVar305 * (fVar195 + fVar325) - (fVar343 + fVar362) * fVar385) * fVar368;
                  auVar289._0_4_ = fVar363 + (float)local_11e8._0_4_ + auVar263._0_4_;
                  auVar289._4_4_ = fVar366 + local_11e8._4_4_ + auVar263._4_4_;
                  auVar289._8_4_ = fStack_11d0 + local_11e8._8_4_ + auVar263._8_4_;
                  auVar289._12_4_ = fStack_11cc + local_11e8._12_4_ + auVar263._12_4_;
                  auVar382._8_4_ = fStack_11d0;
                  auVar382._0_8_ = local_11d8;
                  auVar382._12_4_ = fStack_11cc;
                  auVar235 = minps(auVar382,local_11e8);
                  auVar297 = minps(auVar235,auVar263);
                  auVar312._8_4_ = fStack_11d0;
                  auVar312._0_8_ = local_11d8;
                  auVar312._12_4_ = fStack_11cc;
                  auVar235 = maxps(auVar312,local_11e8);
                  auVar235 = maxps(auVar235,auVar263);
                  local_11f8 = ABS(auVar289._0_4_);
                  fStack_11f4 = ABS(auVar289._4_4_);
                  fStack_11f0 = ABS(auVar289._8_4_);
                  fStack_11ec = ABS(auVar289._12_4_);
                  auVar313._4_4_ = -(uint)(auVar235._4_4_ <= fStack_11f4 * 1.1920929e-07);
                  auVar313._0_4_ = -(uint)(auVar235._0_4_ <= local_11f8 * 1.1920929e-07);
                  auVar313._8_4_ = -(uint)(auVar235._8_4_ <= fStack_11f0 * 1.1920929e-07);
                  auVar313._12_4_ = -(uint)(auVar235._12_4_ <= fStack_11ec * 1.1920929e-07);
                  auVar383._4_4_ = -(uint)(-(fStack_11f4 * 1.1920929e-07) <= auVar297._4_4_);
                  auVar383._0_4_ = -(uint)(-(local_11f8 * 1.1920929e-07) <= auVar297._0_4_);
                  auVar383._8_4_ = -(uint)(-(fStack_11f0 * 1.1920929e-07) <= auVar297._8_4_);
                  auVar383._12_4_ = -(uint)(-(fStack_11ec * 1.1920929e-07) <= auVar297._12_4_);
                  auVar313 = auVar313 | auVar383;
                  iVar159 = movmskps(uVar157,auVar313);
                  lVar170 = local_1158;
                  if (iVar159 != 0) {
                    _local_11c8 = auVar289;
                    uVar174 = (uint)DAT_01fec6c0;
                    uVar183 = DAT_01fec6c0._4_4_;
                    uVar186 = DAT_01fec6c0._8_4_;
                    uVar189 = DAT_01fec6c0._12_4_;
                    uVar158 = -(uint)((float)((uint)(fVar377 * fVar349) & uVar174) <=
                                     (float)((uint)(fVar294 * fVar369) & uVar174));
                    uVar181 = -(uint)((float)((uint)(fVar380 * fVar353) & uVar183) <=
                                     (float)((uint)(fVar379 * fVar372) & uVar183));
                    uVar184 = -(uint)((float)((uint)(fVar381 * fStack_11b0) & uVar186) <=
                                     (float)((uint)(fVar335 * fVar375) & uVar186));
                    uVar187 = -(uint)((float)((uint)(fVar385 * fStack_11ac) & uVar189) <=
                                     (float)((uint)(fVar342 * fVar378) & uVar189));
                    auVar264._0_4_ = (float)((uint)(fVar350 * fVar317) & uVar174);
                    auVar264._4_4_ = (float)((uint)(fVar351 * fVar318) & uVar183);
                    auVar264._8_4_ = (float)((uint)(fVar355 * fVar324) & uVar186);
                    auVar264._12_4_ = (float)((uint)(fVar356 * fVar337) & uVar189);
                    uVar172 = -(uint)(auVar264._0_4_ <=
                                     (float)((uint)(local_1388 * fVar349) & uVar174));
                    uVar182 = -(uint)(auVar264._4_4_ <=
                                     (float)((uint)(fStack_1384 * fVar353) & uVar183));
                    uVar185 = -(uint)(auVar264._8_4_ <=
                                     (float)((uint)(fStack_1380 * fStack_11b0) & uVar186));
                    uVar188 = -(uint)(auVar264._12_4_ <=
                                     (float)((uint)(fStack_137c * fStack_11ac) & uVar189));
                    uVar174 = -(uint)((float)((uint)(fVar370 * fVar294) & uVar174) <=
                                     (float)((uint)(fVar350 * fVar348) & uVar174));
                    uVar183 = -(uint)((float)((uint)(fVar373 * fVar379) & uVar183) <=
                                     (float)((uint)(fVar351 * fVar352) & uVar183));
                    uVar186 = -(uint)((float)((uint)(fVar376 * fVar335) & uVar186) <=
                                     (float)((uint)(fVar355 * fStack_11a0) & uVar186));
                    uVar189 = -(uint)((float)((uint)(fVar305 * fVar342) & uVar189) <=
                                     (float)((uint)(fVar356 * fStack_119c) & uVar189));
                    auVar210._0_4_ = (uint)(fVar294 * fVar317 - fVar377 * fVar349) & uVar158;
                    auVar210._4_4_ = (uint)(fVar379 * fVar318 - fVar380 * fVar353) & uVar181;
                    auVar210._8_4_ = (uint)(fVar335 * fVar324 - fVar381 * fStack_11b0) & uVar184;
                    auVar210._12_4_ = (uint)(fVar342 * fVar337 - fVar385 * fStack_11ac) & uVar187;
                    auVar384._0_4_ = ~uVar158 & (uint)(fVar348 * fVar349 - fVar294 * fVar369);
                    auVar384._4_4_ = ~uVar181 & (uint)(fVar352 * fVar353 - fVar379 * fVar372);
                    auVar384._8_4_ =
                         ~uVar184 & (uint)(fStack_11a0 * fStack_11b0 - fVar335 * fVar375);
                    auVar384._12_4_ =
                         ~uVar187 & (uint)(fStack_119c * fStack_11ac - fVar342 * fVar378);
                    auVar384 = auVar384 | auVar210;
                    auVar322._0_4_ = (uint)(fVar370 * fVar349 - fVar350 * fVar317) & uVar172;
                    auVar322._4_4_ = (uint)(fVar373 * fVar353 - fVar351 * fVar318) & uVar182;
                    auVar322._8_4_ = (uint)(fVar376 * fStack_11b0 - fVar355 * fVar324) & uVar185;
                    auVar322._12_4_ = (uint)(fVar305 * fStack_11ac - fVar356 * fVar337) & uVar188;
                    auVar395._0_4_ = ~uVar172 & (uint)(fVar369 * fVar350 - local_1388 * fVar349);
                    auVar395._4_4_ = ~uVar182 & (uint)(fVar372 * fVar351 - fStack_1384 * fVar353);
                    auVar395._8_4_ =
                         ~uVar185 & (uint)(fVar375 * fVar355 - fStack_1380 * fStack_11b0);
                    auVar395._12_4_ =
                         ~uVar188 & (uint)(fVar378 * fVar356 - fStack_137c * fStack_11ac);
                    auVar395 = auVar395 | auVar322;
                    fVar295 = (float)(~uVar174 & (uint)(local_1388 * fVar294 - fVar350 * fVar348) |
                                     (uint)(fVar350 * fVar377 - fVar370 * fVar294) & uVar174);
                    fVar346 = (float)(~uVar183 & (uint)(fStack_1384 * fVar379 - fVar351 * fVar352) |
                                     (uint)(fVar351 * fVar380 - fVar373 * fVar379) & uVar183);
                    fVar257 = (float)(~uVar186 &
                                      (uint)(fStack_1380 * fVar335 - fVar355 * fStack_11a0) |
                                     (uint)(fVar355 * fVar381 - fVar376 * fVar335) & uVar186);
                    fVar325 = (float)(~uVar189 &
                                      (uint)(fStack_137c * fVar342 - fVar356 * fStack_119c) |
                                     (uint)(fVar356 * fVar385 - fVar305 * fVar342) & uVar189);
                    fVar343 = fVar365 * auVar384._0_4_ +
                              fVar275 * auVar395._0_4_ + fVar368 * fVar295;
                    fVar195 = fVar365 * auVar384._4_4_ +
                              fVar275 * auVar395._4_4_ + fVar368 * fVar346;
                    fVar196 = fVar365 * auVar384._8_4_ +
                              fVar275 * auVar395._8_4_ + fVar368 * fVar257;
                    fVar368 = fVar365 * auVar384._12_4_ +
                              fVar275 * auVar395._12_4_ + fVar368 * fVar325;
                    auVar354._0_4_ = fVar343 + fVar343;
                    auVar354._4_4_ = fVar195 + fVar195;
                    auVar354._8_4_ = fVar196 + fVar196;
                    auVar354._12_4_ = fVar368 + fVar368;
                    fVar365 = fVar304 * auVar384._0_4_ +
                              fVar359 * auVar395._0_4_ + fVar316 * fVar295;
                    fVar275 = fVar327 * auVar384._4_4_ +
                              fVar336 * auVar395._4_4_ + fVar340 * fVar346;
                    fVar294 = fStack_13e0 * auVar384._8_4_ +
                              fVar360 * auVar395._8_4_ + fVar319 * fVar257;
                    fVar379 = fStack_13dc * auVar384._12_4_ +
                              fVar364 * auVar395._12_4_ + fVar328 * fVar325;
                    auVar235 = rcpps(auVar264,auVar354);
                    fVar368 = auVar235._0_4_;
                    fVar343 = auVar235._4_4_;
                    fVar195 = auVar235._8_4_;
                    fVar196 = auVar235._12_4_;
                    auVar246._0_4_ =
                         ((1.0 - auVar354._0_4_ * fVar368) * fVar368 + fVar368) *
                         (fVar365 + fVar365);
                    auVar246._4_4_ =
                         ((1.0 - auVar354._4_4_ * fVar343) * fVar343 + fVar343) *
                         (fVar275 + fVar275);
                    auVar246._8_4_ =
                         ((1.0 - auVar354._8_4_ * fVar195) * fVar195 + fVar195) *
                         (fVar294 + fVar294);
                    auVar246._12_4_ =
                         ((1.0 - auVar354._12_4_ * fVar196) * fVar196 + fVar196) *
                         (fVar379 + fVar379);
                    fVar368 = *(float *)(ray + k * 4 + 0x80);
                    fVar343 = *(float *)(ray + k * 4 + 0x30);
                    auVar265._0_4_ =
                         -(uint)(auVar246._0_4_ <= fVar368 && fVar343 <= auVar246._0_4_) &
                         auVar313._0_4_;
                    auVar265._4_4_ =
                         -(uint)(auVar246._4_4_ <= fVar368 && fVar343 <= auVar246._4_4_) &
                         auVar313._4_4_;
                    auVar265._8_4_ =
                         -(uint)(auVar246._8_4_ <= fVar368 && fVar343 <= auVar246._8_4_) &
                         auVar313._8_4_;
                    auVar265._12_4_ =
                         -(uint)(auVar246._12_4_ <= fVar368 && fVar343 <= auVar246._12_4_) &
                         auVar313._12_4_;
                    iVar159 = movmskps(uVar157,auVar265);
                    if (iVar159 != 0) {
                      aVar266._0_4_ = auVar265._0_4_ & -(uint)(auVar354._0_4_ != 0.0);
                      aVar266._4_4_ = auVar265._4_4_ & -(uint)(auVar354._4_4_ != 0.0);
                      aVar266._8_4_ = auVar265._8_4_ & -(uint)(auVar354._8_4_ != 0.0);
                      aVar266._12_4_ = auVar265._12_4_ & -(uint)(auVar354._12_4_ != 0.0);
                      iVar159 = movmskps(iVar159,(undefined1  [16])aVar266);
                      if (iVar159 != 0) {
                        _local_12a8 = auVar246;
                        local_1298 = auVar384;
                        _local_1288 = auVar395;
                        local_1278[0] = fVar295;
                        local_1278[1] = fVar346;
                        local_1278[2] = fVar257;
                        local_1278[3] = fVar325;
                        auVar247._4_12_ = auVar246._4_12_;
                        auVar247._0_4_ = (float)(int)(*(ushort *)(lVar180 + 8 + lVar178) - 1);
                        auVar332._4_4_ = auVar246._4_4_;
                        auVar332._0_4_ = auVar247._0_4_;
                        auVar332._8_4_ = auVar246._8_4_;
                        auVar332._12_4_ = auVar246._12_4_;
                        auVar235 = rcpss(auVar332,auVar247);
                        fVar368 = (2.0 - auVar247._0_4_ * auVar235._0_4_) * auVar235._0_4_;
                        auVar333._4_12_ = auVar235._4_12_;
                        auVar333._0_4_ = (float)(int)(*(ushort *)(lVar180 + 10 + lVar178) - 1);
                        auVar345._4_4_ = auVar235._4_4_;
                        auVar345._0_4_ = auVar333._0_4_;
                        auVar345._8_4_ = auVar235._8_4_;
                        auVar345._12_4_ = auVar235._12_4_;
                        auVar235 = rcpss(auVar345,auVar333);
                        fVar343 = (2.0 - auVar333._0_4_ * auVar235._0_4_) * auVar235._0_4_;
                        tNear.field_0.v[0] =
                             fVar368 * ((float)(int)local_1248._0_4_ * auVar289._0_4_ +
                                       (auVar289._0_4_ - fVar363));
                        tNear.field_0.v[1] =
                             fVar368 * ((float)(local_1248._0_4_ + 1) * auVar289._4_4_ +
                                       (auVar289._4_4_ - fVar366));
                        tNear.field_0.v[2] =
                             fVar368 * ((float)(local_1248._0_4_ + 1) * auVar289._8_4_ +
                                       (auVar289._8_4_ - fStack_11d0));
                        tNear.field_0.v[3] =
                             fVar368 * ((float)(int)local_1248._0_4_ * auVar289._12_4_ +
                                       (auVar289._12_4_ - fStack_11cc));
                        auVar302._0_4_ =
                             (float)(int)local_1258._0_4_ * auVar289._0_4_ +
                             (auVar289._0_4_ - (float)local_11e8._0_4_);
                        auVar302._4_4_ =
                             (float)(int)local_1258._0_4_ * auVar289._4_4_ +
                             (auVar289._4_4_ - local_11e8._4_4_);
                        auVar302._8_4_ =
                             (float)(local_1258._0_4_ + 1) * auVar289._8_4_ +
                             (auVar289._8_4_ - local_11e8._8_4_);
                        auVar302._12_4_ =
                             (float)(local_1258._0_4_ + 1) * auVar289._12_4_ +
                             (auVar289._12_4_ - local_11e8._12_4_);
                        pGVar20 = (context->scene->geometries).items[uVar161].ptr;
                        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar235 = rcpps(auVar302,auVar289);
                          fVar368 = auVar235._0_4_;
                          fVar195 = auVar235._4_4_;
                          fVar196 = auVar235._8_4_;
                          fVar365 = auVar235._12_4_;
                          fVar368 = (float)(-(uint)(1e-18 <= local_11f8) &
                                           (uint)(((float)DAT_01feca10 - auVar289._0_4_ * fVar368) *
                                                  fVar368 + fVar368));
                          fVar195 = (float)(-(uint)(1e-18 <= fStack_11f4) &
                                           (uint)((DAT_01feca10._4_4_ - auVar289._4_4_ * fVar195) *
                                                  fVar195 + fVar195));
                          fVar196 = (float)(-(uint)(1e-18 <= fStack_11f0) &
                                           (uint)((DAT_01feca10._8_4_ - auVar289._8_4_ * fVar196) *
                                                  fVar196 + fVar196));
                          fVar365 = (float)(-(uint)(1e-18 <= fStack_11ec) &
                                           (uint)((DAT_01feca10._12_4_ - auVar289._12_4_ * fVar365)
                                                  * fVar365 + fVar365));
                          auVar211._0_4_ = tNear.field_0.v[0] * fVar368;
                          auVar211._4_4_ = tNear.field_0.v[1] * fVar195;
                          auVar211._8_4_ = tNear.field_0.v[2] * fVar196;
                          auVar211._12_4_ = tNear.field_0.v[3] * fVar365;
                          local_12c8 = minps(auVar211,_DAT_01feca10);
                          auVar248._0_4_ = fVar343 * auVar302._0_4_ * fVar368;
                          auVar248._4_4_ = fVar343 * auVar302._4_4_ * fVar195;
                          auVar248._8_4_ = fVar343 * auVar302._8_4_ * fVar196;
                          auVar248._12_4_ = fVar343 * auVar302._12_4_ * fVar365;
                          local_12b8 = minps(auVar248,_DAT_01feca10);
                          auVar297 = ~(undefined1  [16])aVar266 & _DAT_01feb9f0 |
                                     auVar246 & (undefined1  [16])aVar266;
                          auVar290._4_4_ = auVar297._0_4_;
                          auVar290._0_4_ = auVar297._4_4_;
                          auVar290._8_4_ = auVar297._12_4_;
                          auVar290._12_4_ = auVar297._8_4_;
                          auVar235 = minps(auVar290,auVar297);
                          auVar212._0_8_ = auVar235._8_8_;
                          auVar212._8_4_ = auVar235._0_4_;
                          auVar212._12_4_ = auVar235._4_4_;
                          auVar235 = minps(auVar212,auVar235);
                          auVar213._0_8_ =
                               CONCAT44(-(uint)(auVar235._4_4_ == auVar297._4_4_) & aVar266._4_4_,
                                        -(uint)(auVar235._0_4_ == auVar297._0_4_) & aVar266._0_4_);
                          auVar213._8_4_ = -(uint)(auVar235._8_4_ == auVar297._8_4_) & aVar266._8_4_
                          ;
                          auVar213._12_4_ =
                               -(uint)(auVar235._12_4_ == auVar297._12_4_) & aVar266._12_4_;
                          iVar159 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar213);
                          aVar267 = aVar266;
                          if (iVar159 != 0) {
                            aVar267.i[2] = auVar213._8_4_;
                            aVar267._0_8_ = auVar213._0_8_;
                            aVar267.i[3] = auVar213._12_4_;
                          }
                          uVar158 = movmskps(iVar159,(undefined1  [16])aVar267);
                          lVar180 = 0;
                          if (uVar158 != 0) {
                            for (; (uVar158 >> lVar180 & 1) == 0; lVar180 = lVar180 + 1) {
                            }
                          }
                          valid.field_0 = aVar266;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar157 = *(undefined4 *)(local_12c8 + lVar180 * 4);
                            uVar165 = *(undefined4 *)(local_12b8 + lVar180 * 4);
                            uVar167 = *(undefined4 *)(local_1298 + lVar180 * 4);
                            fVar368 = local_1278[lVar180 + -4];
                            fVar343 = local_1278[lVar180];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_12a8 + lVar180 * 4);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar167;
                            *(float *)(ray + k * 4 + 0xd0) = fVar368;
                            *(float *)(ray + k * 4 + 0xe0) = fVar343;
                            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar157;
                            *(undefined4 *)(ray + k * 4 + 0x100) = uVar165;
                            *(uint *)(ray + k * 4 + 0x110) = uVar176;
                            *(int *)(ray + k * 4 + 0x120) = (int)uVar161;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_1428 = CONCAT44(local_10b8._0_4_,local_10b8._0_4_);
                            uStack_1420._0_4_ = local_10b8._0_4_;
                            uStack_1420._4_4_ = local_10b8._0_4_;
                            uVar165 = local_10c8._0_4_;
                            local_13e8 = CONCAT44(local_10c8._0_4_,local_10c8._0_4_);
                            fStack_13e0 = (float)local_10c8._0_4_;
                            fStack_13dc = (float)local_10c8._0_4_;
                            uVar108 = *(undefined8 *)(mm_lookupmask_ps + lVar160);
                            uVar109 = *(undefined8 *)(mm_lookupmask_ps + lVar160 + 8);
                            do {
                              uVar167 = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_1078 = *(undefined4 *)(local_12c8 + lVar180 * 4);
                              local_1068 = *(undefined4 *)(local_12b8 + lVar180 * 4);
                              *(undefined4 *)(ray + k * 4 + 0x80) =
                                   *(undefined4 *)(local_12a8 + lVar180 * 4);
                              args.context = context->user;
                              local_10a8 = *(undefined4 *)(local_1298 + lVar180 * 4);
                              fVar368 = local_1278[lVar180 + -4];
                              fVar343 = local_1278[lVar180];
                              local_1098._4_4_ = fVar368;
                              local_1098._0_4_ = fVar368;
                              fStack_1090 = fVar368;
                              fStack_108c = fVar368;
                              local_1088._4_4_ = fVar343;
                              local_1088._0_4_ = fVar343;
                              fStack_1080 = fVar343;
                              fStack_107c = fVar343;
                              uStack_10a4 = local_10a8;
                              uStack_10a0 = local_10a8;
                              uStack_109c = local_10a8;
                              uStack_1074 = local_1078;
                              uStack_1070 = local_1078;
                              uStack_106c = local_1078;
                              uStack_1064 = local_1068;
                              uStack_1060 = local_1068;
                              uStack_105c = local_1068;
                              local_1058 = local_13e8;
                              uStack_1050 = CONCAT44(uVar165,uVar165);
                              local_1048 = local_1428;
                              uStack_1040 = uStack_1420;
                              local_1038 = (args.context)->instID[0];
                              uStack_1034 = local_1038;
                              uStack_1030 = local_1038;
                              uStack_102c = local_1038;
                              local_1028 = (args.context)->instPrimID[0];
                              uStack_1024 = local_1028;
                              uStack_1020 = local_1028;
                              uStack_101c = local_1028;
                              args.valid = (int *)&local_13c8;
                              pRVar169 = (RTCIntersectArguments *)pGVar20->userPtr;
                              args.hit = (RTCHitN *)&local_10a8;
                              args.N = 4;
                              p_Var164 = pGVar20->intersectionFilterN;
                              local_13c8 = uVar108;
                              uStack_13c0 = uVar109;
                              args.geometryUserPtr = pRVar169;
                              args.ray = (RTCRayN *)ray;
                              if (p_Var164 != (RTCFilterFunctionN)0x0) {
                                p_Var164 = (RTCFilterFunctionN)(*p_Var164)(&args);
                              }
                              auVar217._0_4_ = -(uint)((int)local_13c8 == 0);
                              auVar217._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                              auVar217._8_4_ = -(uint)((int)uStack_13c0 == 0);
                              auVar217._12_4_ = -(uint)(uStack_13c0._4_4_ == 0);
                              uVar158 = movmskps((int)p_Var164,auVar217);
                              pRVar163 = (RTCRayN *)(ulong)(uVar158 ^ 0xf);
                              if ((uVar158 ^ 0xf) == 0) {
                                auVar217 = auVar217 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar169 = context->args;
                                p_Var164 = pRVar169->filter;
                                if ((p_Var164 != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar169->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                     != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                                  p_Var164 = (RTCFilterFunctionN)(*p_Var164)(&args);
                                }
                                auVar253._0_4_ = -(uint)((int)local_13c8 == 0);
                                auVar253._4_4_ = -(uint)(local_13c8._4_4_ == 0);
                                auVar253._8_4_ = -(uint)((int)uStack_13c0 == 0);
                                auVar253._12_4_ = -(uint)(uStack_13c0._4_4_ == 0);
                                auVar217 = auVar253 ^ _DAT_01febe20;
                                uVar158 = movmskps((int)p_Var164,auVar253);
                                pRVar163 = (RTCRayN *)(ulong)(uVar158 ^ 0xf);
                                if ((uVar158 ^ 0xf) != 0) {
                                  auVar270._0_4_ = *(uint *)(args.ray + 0xc0) & auVar253._0_4_;
                                  auVar270._4_4_ = *(uint *)(args.ray + 0xc4) & auVar253._4_4_;
                                  auVar270._8_4_ = *(uint *)(args.ray + 200) & auVar253._8_4_;
                                  auVar270._12_4_ = *(uint *)(args.ray + 0xcc) & auVar253._12_4_;
                                  auVar323._0_4_ = ~auVar253._0_4_ & *(uint *)args.hit;
                                  auVar323._4_4_ = ~auVar253._4_4_ & *(uint *)(args.hit + 4);
                                  auVar323._8_4_ = ~auVar253._8_4_ & *(uint *)(args.hit + 8);
                                  auVar323._12_4_ = ~auVar253._12_4_ & *(uint *)(args.hit + 0xc);
                                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar323 | auVar270;
                                  uVar158 = *(uint *)(args.hit + 0x14);
                                  uVar172 = *(uint *)(args.hit + 0x18);
                                  uVar174 = *(uint *)(args.hit + 0x1c);
                                  *(uint *)(args.ray + 0xd0) =
                                       ~auVar253._0_4_ & *(uint *)(args.hit + 0x10) |
                                       *(uint *)(args.ray + 0xd0) & auVar253._0_4_;
                                  *(uint *)(args.ray + 0xd4) =
                                       ~auVar253._4_4_ & uVar158 |
                                       *(uint *)(args.ray + 0xd4) & auVar253._4_4_;
                                  *(uint *)(args.ray + 0xd8) =
                                       ~auVar253._8_4_ & uVar172 |
                                       *(uint *)(args.ray + 0xd8) & auVar253._8_4_;
                                  *(uint *)(args.ray + 0xdc) =
                                       ~auVar253._12_4_ & uVar174 |
                                       *(uint *)(args.ray + 0xdc) & auVar253._12_4_;
                                  auVar303._0_4_ = *(uint *)(args.ray + 0xe0) & auVar253._0_4_;
                                  auVar303._4_4_ = *(uint *)(args.ray + 0xe4) & auVar253._4_4_;
                                  auVar303._8_4_ = *(uint *)(args.ray + 0xe8) & auVar253._8_4_;
                                  auVar303._12_4_ = *(uint *)(args.ray + 0xec) & auVar253._12_4_;
                                  auVar271._0_4_ = ~auVar253._0_4_ & *(uint *)(args.hit + 0x20);
                                  auVar271._4_4_ = ~auVar253._4_4_ & *(uint *)(args.hit + 0x24);
                                  auVar271._8_4_ = ~auVar253._8_4_ & *(uint *)(args.hit + 0x28);
                                  auVar271._12_4_ = ~auVar253._12_4_ & *(uint *)(args.hit + 0x2c);
                                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar271 | auVar303;
                                  auVar315._0_4_ = *(uint *)(args.ray + 0xf0) & auVar253._0_4_;
                                  auVar315._4_4_ = *(uint *)(args.ray + 0xf4) & auVar253._4_4_;
                                  auVar315._8_4_ = *(uint *)(args.ray + 0xf8) & auVar253._8_4_;
                                  auVar315._12_4_ = *(uint *)(args.ray + 0xfc) & auVar253._12_4_;
                                  auVar272._0_4_ = ~auVar253._0_4_ & *(uint *)(args.hit + 0x30);
                                  auVar272._4_4_ = ~auVar253._4_4_ & *(uint *)(args.hit + 0x34);
                                  auVar272._8_4_ = ~auVar253._8_4_ & *(uint *)(args.hit + 0x38);
                                  auVar272._12_4_ = ~auVar253._12_4_ & *(uint *)(args.hit + 0x3c);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar272 | auVar315;
                                  uVar158 = *(uint *)(args.hit + 0x44);
                                  uVar172 = *(uint *)(args.hit + 0x48);
                                  uVar174 = *(uint *)(args.hit + 0x4c);
                                  *(uint *)(args.ray + 0x100) =
                                       ~auVar253._0_4_ & *(uint *)(args.hit + 0x40) |
                                       *(uint *)(args.ray + 0x100) & auVar253._0_4_;
                                  *(uint *)(args.ray + 0x104) =
                                       ~auVar253._4_4_ & uVar158 |
                                       *(uint *)(args.ray + 0x104) & auVar253._4_4_;
                                  *(uint *)(args.ray + 0x108) =
                                       ~auVar253._8_4_ & uVar172 |
                                       *(uint *)(args.ray + 0x108) & auVar253._8_4_;
                                  *(uint *)(args.ray + 0x10c) =
                                       ~auVar253._12_4_ & uVar174 |
                                       *(uint *)(args.ray + 0x10c) & auVar253._12_4_;
                                  uVar158 = *(uint *)(args.hit + 0x54);
                                  uVar172 = *(uint *)(args.hit + 0x58);
                                  uVar174 = *(uint *)(args.hit + 0x5c);
                                  *(uint *)(args.ray + 0x110) =
                                       *(uint *)(args.ray + 0x110) & auVar253._0_4_ |
                                       ~auVar253._0_4_ & *(uint *)(args.hit + 0x50);
                                  *(uint *)(args.ray + 0x114) =
                                       *(uint *)(args.ray + 0x114) & auVar253._4_4_ |
                                       ~auVar253._4_4_ & uVar158;
                                  *(uint *)(args.ray + 0x118) =
                                       *(uint *)(args.ray + 0x118) & auVar253._8_4_ |
                                       ~auVar253._8_4_ & uVar172;
                                  *(uint *)(args.ray + 0x11c) =
                                       *(uint *)(args.ray + 0x11c) & auVar253._12_4_ |
                                       ~auVar253._12_4_ & uVar174;
                                  uVar158 = *(uint *)(args.hit + 100);
                                  uVar172 = *(uint *)(args.hit + 0x68);
                                  uVar174 = *(uint *)(args.hit + 0x6c);
                                  *(uint *)(args.ray + 0x120) =
                                       *(uint *)(args.ray + 0x120) & auVar253._0_4_ |
                                       ~auVar253._0_4_ & *(uint *)(args.hit + 0x60);
                                  *(uint *)(args.ray + 0x124) =
                                       *(uint *)(args.ray + 0x124) & auVar253._4_4_ |
                                       ~auVar253._4_4_ & uVar158;
                                  *(uint *)(args.ray + 0x128) =
                                       *(uint *)(args.ray + 0x128) & auVar253._8_4_ |
                                       ~auVar253._8_4_ & uVar172;
                                  *(uint *)(args.ray + 300) =
                                       *(uint *)(args.ray + 300) & auVar253._12_4_ |
                                       ~auVar253._12_4_ & uVar174;
                                  auVar273._0_4_ = *(uint *)(args.ray + 0x130) & auVar253._0_4_;
                                  auVar273._4_4_ = *(uint *)(args.ray + 0x134) & auVar253._4_4_;
                                  auVar273._8_4_ = *(uint *)(args.ray + 0x138) & auVar253._8_4_;
                                  auVar273._12_4_ = *(uint *)(args.ray + 0x13c) & auVar253._12_4_;
                                  auVar292._0_4_ = ~auVar253._0_4_ & *(uint *)(args.hit + 0x70);
                                  auVar292._4_4_ = ~auVar253._4_4_ & *(uint *)(args.hit + 0x74);
                                  auVar292._8_4_ = ~auVar253._8_4_ & *(uint *)(args.hit + 0x78);
                                  auVar292._12_4_ = ~auVar253._12_4_ & *(uint *)(args.hit + 0x7c);
                                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar292 | auVar273;
                                  uVar158 = *(uint *)(args.hit + 0x84);
                                  uVar172 = *(uint *)(args.hit + 0x88);
                                  uVar174 = *(uint *)(args.hit + 0x8c);
                                  *(uint *)(args.ray + 0x140) =
                                       ~auVar253._0_4_ & *(uint *)(args.hit + 0x80) |
                                       *(uint *)(args.ray + 0x140) & auVar253._0_4_;
                                  *(uint *)(args.ray + 0x144) =
                                       ~auVar253._4_4_ & uVar158 |
                                       *(uint *)(args.ray + 0x144) & auVar253._4_4_;
                                  *(uint *)(args.ray + 0x148) =
                                       ~auVar253._8_4_ & uVar172 |
                                       *(uint *)(args.ray + 0x148) & auVar253._8_4_;
                                  *(uint *)(args.ray + 0x14c) =
                                       ~auVar253._12_4_ & uVar174 |
                                       *(uint *)(args.ray + 0x14c) & auVar253._12_4_;
                                  pRVar163 = args.ray;
                                  pRVar169 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              auVar218._0_4_ = auVar217._0_4_ << 0x1f;
                              auVar218._4_4_ = auVar217._4_4_ << 0x1f;
                              auVar218._8_4_ = auVar217._8_4_ << 0x1f;
                              auVar218._12_4_ = auVar217._12_4_ << 0x1f;
                              iVar159 = movmskps((int)pRVar163,auVar218);
                              if (iVar159 == 0) {
                                *(undefined4 *)(ray + k * 4 + 0x80) = uVar167;
                              }
                              valid.field_0.v[lVar180] = 0.0;
                              fVar368 = *(float *)(ray + k * 4 + 0x80);
                              valid.field_0.i[0] =
                                   -(uint)(local_12a8._0_4_ <= fVar368) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)(local_12a8._4_4_ <= fVar368) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(local_12a8._8_4_ <= fVar368) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(local_12a8._12_4_ <= fVar368) & valid.field_0.i[3];
                              iVar159 = movmskps(uVar157,(undefined1  [16])valid.field_0);
                              if (iVar159 != 0) {
                                auVar254._0_4_ = (uint)local_12a8._0_4_ & valid.field_0.i[0];
                                auVar254._4_4_ = (uint)local_12a8._4_4_ & valid.field_0.i[1];
                                auVar254._8_4_ = (uint)local_12a8._8_4_ & valid.field_0.i[2];
                                auVar254._12_4_ = (uint)local_12a8._12_4_ & valid.field_0.i[3];
                                auVar274._0_8_ =
                                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                     0x7f8000007f800000;
                                auVar274._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                                auVar274._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                                auVar274 = auVar274 | auVar254;
                                auVar293._4_4_ = auVar274._0_4_;
                                auVar293._0_4_ = auVar274._4_4_;
                                auVar293._8_4_ = auVar274._12_4_;
                                auVar293._12_4_ = auVar274._8_4_;
                                auVar235 = minps(auVar293,auVar274);
                                auVar255._0_8_ = auVar235._8_8_;
                                auVar255._8_4_ = auVar235._0_4_;
                                auVar255._12_4_ = auVar235._4_4_;
                                auVar235 = minps(auVar255,auVar235);
                                auVar256._0_8_ =
                                     CONCAT44(-(uint)(auVar235._4_4_ == auVar274._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar235._0_4_ == auVar274._0_4_) &
                                              valid.field_0.i[0]);
                                auVar256._8_4_ =
                                     -(uint)(auVar235._8_4_ == auVar274._8_4_) & valid.field_0.i[2];
                                auVar256._12_4_ =
                                     -(uint)(auVar235._12_4_ == auVar274._12_4_) &
                                     valid.field_0.i[3];
                                iVar166 = movmskps((int)pRVar169,auVar256);
                                aVar219 = valid.field_0;
                                if (iVar166 != 0) {
                                  aVar219.i[2] = auVar256._8_4_;
                                  aVar219._0_8_ = auVar256._0_8_;
                                  aVar219.i[3] = auVar256._12_4_;
                                }
                                uVar167 = movmskps(iVar166,(undefined1  [16])aVar219);
                                uVar161 = CONCAT44((int)((ulong)pRVar169 >> 0x20),uVar167);
                                lVar180 = 0;
                                if (uVar161 != 0) {
                                  for (; (uVar161 >> lVar180 & 1) == 0; lVar180 = lVar180 + 1) {
                                  }
                                }
                              }
                              lVar170 = local_1158;
                            } while ((char)iVar159 != '\0');
                          }
                        }
                      }
                    }
                  }
                }
                local_1140 = local_1140 & local_1140 - 1;
              } while (local_1140 != 0);
            }
            lVar170 = lVar170 + 1;
          } while (lVar170 != local_1198);
        }
        local_1218 = *(int *)(ray + k * 4 + 0x80);
        iStack_1214 = local_1218;
        iStack_1210 = local_1218;
        iStack_120c = local_1218;
        fVar326 = fStack_112c;
        fVar334 = fStack_1130;
        fVar335 = fStack_1134;
        fVar338 = local_1138;
        fVar325 = fStack_122c;
        fVar257 = fStack_1230;
        fVar346 = fStack_1234;
        fVar295 = local_1238;
        fVar379 = fStack_121c;
        fVar294 = fStack_1220;
        fVar275 = fStack_1224;
        fVar365 = local_1228;
        fVar196 = fStack_125c;
        fVar195 = fStack_1260;
        fVar343 = fStack_1264;
        fVar368 = local_1268;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }